

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  undefined1 (*pauVar1) [16];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  size_t sVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined4 uVar27;
  ulong uVar28;
  long lVar29;
  unsigned_long uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  float fVar34;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar89;
  float fVar91;
  undefined1 auVar59 [16];
  float fVar93;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar90;
  float fVar92;
  float fVar94;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar113;
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar120;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar115;
  float fVar118;
  float fVar121;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar122;
  float fVar133;
  float fVar134;
  undefined1 auVar123 [16];
  float fVar135;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  vfloat4 b1_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  vfloat4 b1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar157;
  float fVar169;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar167;
  float fVar168;
  undefined1 auVar166 [64];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar178;
  float fVar179;
  Vec3fa n1;
  float fVar180;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar181;
  vfloat4 b0;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar186;
  __m128 a_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  vfloat4 b1_3;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar200;
  float fVar201;
  Vec3fa n0;
  float fVar202;
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  __m128 a;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  size_t local_338;
  size_t local_330;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar30 = r->_begin;
  local_178._8_4_ = 0xff800000;
  local_178._0_8_ = 0xff800000ff800000;
  local_178._12_4_ = 0xff800000;
  local_338 = 0;
  auVar156 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  auVar166 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  local_168._8_4_ = 0x7f800000;
  local_168._0_8_ = 0x7f8000007f800000;
  local_168._12_4_ = 0x7f800000;
  local_188._8_4_ = 0x7f800000;
  local_188._0_8_ = 0x7f8000007f800000;
  local_188._12_4_ = 0x7f800000;
  local_330 = k;
  local_158 = local_178;
  do {
    if (r->_end <= uVar30) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
        field_0 = local_188._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               lower.field_0 + 8) = local_188._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
        field_0 = local_178._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
               upper.field_0 + 8) = local_178._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_168._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_168._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_158._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_158._8_8_;
      __return_storage_ptr__->end = local_338;
      return __return_storage_ptr__;
    }
    pBVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices
             .items;
    uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                               super_CurveGeometry.field_0x68 * uVar30);
    uVar28 = (ulong)uVar5;
    uVar31 = (ulong)(uVar5 + 3);
    if (uVar31 < (pBVar6->super_RawBufferView).num) {
      uVar33 = (ulong)(uVar5 + 1);
      uVar32 = (ulong)(uVar5 + 2);
      pBVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               normals.items;
      fVar58 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               maxRadiusScale;
      lVar29 = 0;
      do {
        if ((ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                    super_Geometry.numTimeSteps - 1) * 0x38 + 0x70 == lVar29 + 0x38) {
          pcVar10 = (pBVar6->super_RawBufferView).ptr_ofs;
          sVar11 = (pBVar6->super_RawBufferView).stride;
          fVar58 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   maxRadiusScale;
          auVar39 = vinsertps_avx(*(undefined1 (*) [16])(pcVar10 + sVar11 * uVar28),
                                  ZEXT416((uint)(fVar58 * *(float *)(pcVar10 + sVar11 * uVar28 + 0xc
                                                                    ))),0x30);
          auVar41 = vinsertps_avx(*(undefined1 (*) [16])(pcVar10 + sVar11 * uVar33),
                                  ZEXT416((uint)(fVar58 * *(float *)(pcVar10 + sVar11 * uVar33 + 0xc
                                                                    ))),0x30);
          auVar70 = vinsertps_avx(*(undefined1 (*) [16])(pcVar10 + sVar11 * uVar32),
                                  ZEXT416((uint)(fVar58 * *(float *)(pcVar10 + sVar11 * uVar32 + 0xc
                                                                    ))),0x30);
          fVar94 = auVar70._0_4_ * 0.0;
          fVar96 = auVar70._4_4_ * 0.0;
          fVar113 = auVar70._8_4_ * 0.0;
          fVar114 = auVar70._12_4_ * 0.0;
          auVar42 = vinsertps_avx(*(undefined1 (*) [16])(pcVar10 + sVar11 * uVar31),
                                  ZEXT416((uint)(fVar58 * *(float *)(pcVar10 + sVar11 * uVar31 + 0xc
                                                                    ))),0x30);
          local_228 = auVar42._0_4_;
          fStack_224 = auVar42._4_4_;
          fStack_220 = auVar42._8_4_;
          fStack_21c = auVar42._12_4_;
          fVar174 = fVar94 + local_228 * 0.0;
          fVar178 = fVar96 + fStack_224 * 0.0;
          fVar179 = fVar113 + fStack_220 * 0.0;
          fVar180 = fVar114 + fStack_21c * 0.0;
          auVar73._0_4_ = fVar174 + auVar41._0_4_ * 3.0;
          auVar73._4_4_ = fVar178 + auVar41._4_4_ * 3.0;
          auVar73._8_4_ = fVar179 + auVar41._8_4_ * 3.0;
          auVar73._12_4_ = fVar180 + auVar41._12_4_ * 3.0;
          fVar157 = auVar39._0_4_;
          auVar103._0_4_ = fVar157 * 3.0;
          fVar167 = auVar39._4_4_;
          auVar103._4_4_ = fVar167 * 3.0;
          fVar168 = auVar39._8_4_;
          auVar103._8_4_ = fVar168 * 3.0;
          fVar169 = auVar39._12_4_;
          auVar103._12_4_ = fVar169 * 3.0;
          auVar78 = vsubps_avx(auVar73,auVar103);
          auVar73 = vshufps_avx(auVar78,auVar78,0xc9);
          pBVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   normals.items;
          pcVar10 = (pBVar7->super_RawBufferView).ptr_ofs;
          sVar11 = (pBVar7->super_RawBufferView).stride;
          pfVar2 = (float *)(pcVar10 + uVar28 * sVar11);
          fVar93 = *pfVar2;
          fVar34 = pfVar2[1];
          fVar53 = pfVar2[2];
          fVar54 = pfVar2[3];
          pfVar2 = (float *)(pcVar10 + uVar33 * sVar11);
          fVar97 = *pfVar2 * 0.0;
          fVar115 = pfVar2[1] * 0.0;
          fVar118 = pfVar2[2] * 0.0;
          fVar121 = pfVar2[3] * 0.0;
          pfVar3 = (float *)(pcVar10 + uVar32 * sVar11);
          fVar122 = *pfVar3 * 0.0;
          fVar133 = pfVar3[1] * 0.0;
          fVar134 = pfVar3[2] * 0.0;
          fVar135 = pfVar3[3] * 0.0;
          pfVar4 = (float *)(pcVar10 + sVar11 * uVar31);
          fVar55 = *pfVar4;
          fVar57 = pfVar4[1];
          fVar90 = pfVar4[2];
          fVar92 = pfVar4[3];
          fVar116 = fVar55 * 0.0 + fVar122;
          fVar117 = fVar57 * 0.0 + fVar133;
          fVar119 = fVar90 * 0.0 + fVar134;
          fVar120 = fVar92 * 0.0 + fVar135;
          auVar188._0_4_ = fVar97 + fVar116 + fVar93;
          auVar188._4_4_ = fVar115 + fVar117 + fVar34;
          auVar188._8_4_ = fVar118 + fVar119 + fVar53;
          auVar188._12_4_ = fVar121 + fVar120 + fVar54;
          auVar194._0_4_ = auVar73._0_4_ * auVar188._0_4_;
          auVar194._4_4_ = auVar73._4_4_ * auVar188._4_4_;
          auVar194._8_4_ = auVar73._8_4_ * auVar188._8_4_;
          auVar194._12_4_ = auVar73._12_4_ * auVar188._12_4_;
          auVar39 = vshufps_avx(auVar188,auVar188,0xc9);
          fVar58 = auVar78._0_4_;
          auVar189._0_4_ = auVar39._0_4_ * fVar58;
          fVar56 = auVar78._4_4_;
          auVar189._4_4_ = auVar39._4_4_ * fVar56;
          fVar89 = auVar78._8_4_;
          auVar189._8_4_ = auVar39._8_4_ * fVar89;
          fVar91 = auVar78._12_4_;
          auVar189._12_4_ = auVar39._12_4_ * fVar91;
          auVar39 = vsubps_avx(auVar194,auVar189);
          auVar71 = vshufps_avx(auVar39,auVar39,0xc9);
          auVar39 = vdpps_avx(auVar71,auVar71,0x7f);
          fVar181 = auVar39._0_4_;
          auVar203._4_12_ = ZEXT812(0) << 0x20;
          auVar203._0_4_ = fVar181;
          auVar42 = vrsqrtss_avx(auVar203,auVar203);
          fVar95 = auVar42._0_4_;
          auVar67._0_4_ = *pfVar2 * 3.0 + fVar116;
          auVar67._4_4_ = pfVar2[1] * 3.0 + fVar117;
          auVar67._8_4_ = pfVar2[2] * 3.0 + fVar119;
          auVar67._12_4_ = pfVar2[3] * 3.0 + fVar120;
          auVar161._0_4_ = fVar93 * 3.0;
          auVar161._4_4_ = fVar34 * 3.0;
          auVar161._8_4_ = fVar53 * 3.0;
          auVar161._12_4_ = fVar54 * 3.0;
          auVar42 = vsubps_avx(auVar67,auVar161);
          auVar162._0_4_ = auVar73._0_4_ * auVar42._0_4_;
          auVar162._4_4_ = auVar73._4_4_ * auVar42._4_4_;
          auVar162._8_4_ = auVar73._8_4_ * auVar42._8_4_;
          auVar162._12_4_ = auVar73._12_4_ * auVar42._12_4_;
          auVar42 = vshufps_avx(auVar42,auVar42,0xc9);
          auVar68._0_4_ = fVar58 * auVar42._0_4_;
          auVar68._4_4_ = fVar56 * auVar42._4_4_;
          auVar68._8_4_ = fVar89 * auVar42._8_4_;
          auVar68._12_4_ = fVar91 * auVar42._12_4_;
          auVar42 = vsubps_avx(auVar162,auVar68);
          auVar73 = vshufps_avx(auVar42,auVar42,0xc9);
          auVar42 = vdpps_avx(auVar71,auVar73,0x7f);
          auVar39 = vshufps_avx(auVar39,auVar39,0);
          auVar69._0_4_ = auVar39._0_4_ * auVar73._0_4_;
          auVar69._4_4_ = auVar39._4_4_ * auVar73._4_4_;
          auVar69._8_4_ = auVar39._8_4_ * auVar73._8_4_;
          auVar69._12_4_ = auVar39._12_4_ * auVar73._12_4_;
          auVar39 = vshufps_avx(auVar42,auVar42,0);
          auVar153._0_4_ = auVar71._0_4_ * auVar39._0_4_;
          auVar153._4_4_ = auVar71._4_4_ * auVar39._4_4_;
          auVar153._8_4_ = auVar71._8_4_ * auVar39._8_4_;
          auVar153._12_4_ = auVar71._12_4_ * auVar39._12_4_;
          auVar44 = vsubps_avx(auVar69,auVar153);
          auVar39 = vrcpss_avx(auVar203,auVar203);
          fVar116 = auVar41._0_4_ * 0.0;
          fVar117 = auVar41._4_4_ * 0.0;
          fVar119 = auVar41._8_4_ * 0.0;
          fVar120 = auVar41._12_4_ * 0.0;
          auVar104._0_4_ = fVar116 + fVar174 + fVar157;
          auVar104._4_4_ = fVar117 + fVar178 + fVar167;
          auVar104._8_4_ = fVar119 + fVar179 + fVar168;
          auVar104._12_4_ = fVar120 + fVar180 + fVar169;
          auVar39 = ZEXT416((uint)((2.0 - fVar181 * auVar39._0_4_) * auVar39._0_4_));
          auVar39 = vshufps_avx(auVar39,auVar39,0);
          auVar42 = vshufps_avx(auVar104,auVar104,0xff);
          auVar41 = ZEXT416((uint)(fVar95 * 1.5 - fVar95 * fVar95 * fVar181 * 0.5 * fVar95));
          auVar41 = vshufps_avx(auVar41,auVar41,0);
          fVar95 = auVar71._0_4_ * auVar41._0_4_;
          fVar174 = auVar71._4_4_ * auVar41._4_4_;
          fVar178 = auVar71._8_4_ * auVar41._8_4_;
          fVar179 = auVar71._12_4_ * auVar41._12_4_;
          auVar73 = vshufps_avx(auVar78,auVar78,0xff);
          local_1e8._0_4_ = fVar95 * auVar42._0_4_;
          local_1e8._4_4_ = fVar174 * auVar42._4_4_;
          fStack_1e0 = fVar178 * auVar42._8_4_;
          fStack_1dc = fVar179 * auVar42._12_4_;
          local_1c8._0_4_ =
               fVar95 * auVar73._0_4_ +
               auVar42._0_4_ * auVar41._0_4_ * auVar44._0_4_ * auVar39._0_4_;
          local_1c8._4_4_ =
               fVar174 * auVar73._4_4_ +
               auVar42._4_4_ * auVar41._4_4_ * auVar44._4_4_ * auVar39._4_4_;
          fStack_1c0 = fVar178 * auVar73._8_4_ +
                       auVar42._8_4_ * auVar41._8_4_ * auVar44._8_4_ * auVar39._8_4_;
          fStack_1bc = fVar179 * auVar73._12_4_ +
                       auVar42._12_4_ * auVar41._12_4_ * auVar44._12_4_ * auVar39._12_4_;
          auVar42._0_4_ = fVar157 * 0.0;
          auVar42._4_4_ = fVar167 * 0.0;
          auVar42._8_4_ = fVar168 * 0.0;
          auVar42._12_4_ = fVar169 * 0.0;
          auVar41._0_4_ = local_228 * 3.0;
          auVar41._4_4_ = fStack_224 * 3.0;
          auVar41._8_4_ = fStack_220 * 3.0;
          auVar41._12_4_ = fStack_21c * 3.0;
          auVar141._0_4_ = auVar70._0_4_ * 3.0;
          auVar141._4_4_ = auVar70._4_4_ * 3.0;
          auVar141._8_4_ = auVar70._8_4_ * 3.0;
          auVar141._12_4_ = auVar70._12_4_ * 3.0;
          auVar39 = vsubps_avx(auVar41,auVar141);
          auVar70._0_4_ = fVar116 + auVar39._0_4_;
          auVar70._4_4_ = fVar117 + auVar39._4_4_;
          auVar70._8_4_ = fVar119 + auVar39._8_4_;
          auVar70._12_4_ = fVar120 + auVar39._12_4_;
          auVar67 = vsubps_avx(auVar70,auVar42);
          auVar41 = vshufps_avx(auVar67,auVar67,0xc9);
          auVar175._0_4_ = fVar93 * 0.0;
          auVar175._4_4_ = fVar34 * 0.0;
          auVar175._8_4_ = fVar53 * 0.0;
          auVar175._12_4_ = fVar54 * 0.0;
          auVar71._0_4_ = auVar175._0_4_ + fVar97 + fVar55 + fVar122;
          auVar71._4_4_ = auVar175._4_4_ + fVar115 + fVar57 + fVar133;
          auVar71._8_4_ = auVar175._8_4_ + fVar118 + fVar90 + fVar134;
          auVar71._12_4_ = auVar175._12_4_ + fVar121 + fVar92 + fVar135;
          auVar105._0_4_ = auVar41._0_4_ * auVar71._0_4_;
          auVar105._4_4_ = auVar41._4_4_ * auVar71._4_4_;
          auVar105._8_4_ = auVar41._8_4_ * auVar71._8_4_;
          auVar105._12_4_ = auVar41._12_4_ * auVar71._12_4_;
          auVar39 = vshufps_avx(auVar71,auVar71,0xc9);
          fVar95 = auVar67._0_4_;
          auVar72._0_4_ = fVar95 * auVar39._0_4_;
          fVar122 = auVar67._4_4_;
          auVar72._4_4_ = fVar122 * auVar39._4_4_;
          fVar133 = auVar67._8_4_;
          auVar72._8_4_ = fVar133 * auVar39._8_4_;
          fVar134 = auVar67._12_4_;
          auVar72._12_4_ = fVar134 * auVar39._12_4_;
          auVar39 = vsubps_avx(auVar105,auVar72);
          auVar70 = vshufps_avx(auVar39,auVar39,0xc9);
          auVar39 = vdpps_avx(auVar70,auVar70,0x7f);
          auVar43._0_4_ = auVar42._0_4_ + fVar116 + local_228 + fVar94;
          auVar43._4_4_ = auVar42._4_4_ + fVar117 + fStack_224 + fVar96;
          auVar43._8_4_ = auVar42._8_4_ + fVar119 + fStack_220 + fVar113;
          auVar43._12_4_ = auVar42._12_4_ + fVar120 + fStack_21c + fVar114;
          fVar34 = auVar39._0_4_;
          auVar190._4_12_ = ZEXT812(0) << 0x20;
          auVar190._0_4_ = fVar34;
          auVar42 = vrsqrtss_avx(auVar190,auVar190);
          fVar93 = auVar42._0_4_;
          auVar42 = vshufps_avx(auVar43,auVar43,0xff);
          auVar73 = ZEXT416((uint)(fVar93 * 1.5 - fVar93 * fVar93 * fVar34 * 0.5 * fVar93));
          auVar73 = vshufps_avx(auVar73,auVar73,0);
          auVar74._0_4_ = fVar55 * 3.0;
          auVar74._4_4_ = fVar57 * 3.0;
          auVar74._8_4_ = fVar90 * 3.0;
          auVar74._12_4_ = fVar92 * 3.0;
          auVar149._0_4_ = *pfVar3 * 3.0;
          auVar149._4_4_ = pfVar3[1] * 3.0;
          auVar149._8_4_ = pfVar3[2] * 3.0;
          auVar149._12_4_ = pfVar3[3] * 3.0;
          auVar71 = vsubps_avx(auVar74,auVar149);
          fVar93 = auVar73._0_4_ * auVar70._0_4_;
          fVar53 = auVar73._4_4_ * auVar70._4_4_;
          fVar54 = auVar73._8_4_ * auVar70._8_4_;
          fVar55 = auVar73._12_4_ * auVar70._12_4_;
          auVar75._0_4_ = fVar97 + auVar71._0_4_;
          auVar75._4_4_ = fVar115 + auVar71._4_4_;
          auVar75._8_4_ = fVar118 + auVar71._8_4_;
          auVar75._12_4_ = fVar121 + auVar71._12_4_;
          auVar71 = vshufps_avx(auVar67,auVar67,0xff);
          local_2c8._0_4_ = auVar42._0_4_ * fVar93;
          local_2c8._4_4_ = auVar42._4_4_ * fVar53;
          fStack_2c0 = auVar42._8_4_ * fVar54;
          fStack_2bc = auVar42._12_4_ * fVar55;
          auVar68 = vsubps_avx(auVar75,auVar175);
          auVar44 = vshufps_avx(auVar39,auVar39,0);
          auVar176._0_4_ = auVar41._0_4_ * auVar68._0_4_;
          auVar176._4_4_ = auVar41._4_4_ * auVar68._4_4_;
          auVar176._8_4_ = auVar41._8_4_ * auVar68._8_4_;
          auVar176._12_4_ = auVar41._12_4_ * auVar68._12_4_;
          auVar39 = vshufps_avx(auVar68,auVar68,0xc9);
          auVar76._0_4_ = fVar95 * auVar39._0_4_;
          auVar76._4_4_ = fVar122 * auVar39._4_4_;
          auVar76._8_4_ = fVar133 * auVar39._8_4_;
          auVar76._12_4_ = fVar134 * auVar39._12_4_;
          auVar39 = vsubps_avx(auVar176,auVar76);
          auVar41 = vshufps_avx(auVar39,auVar39,0xc9);
          auVar39 = vdpps_avx(auVar70,auVar41,0x7f);
          auVar77._0_4_ = auVar44._0_4_ * auVar41._0_4_;
          auVar77._4_4_ = auVar44._4_4_ * auVar41._4_4_;
          auVar77._8_4_ = auVar44._8_4_ * auVar41._8_4_;
          auVar77._12_4_ = auVar44._12_4_ * auVar41._12_4_;
          auVar124._0_4_ = auVar43._0_4_ + (float)local_2c8._0_4_;
          auVar124._4_4_ = auVar43._4_4_ + (float)local_2c8._4_4_;
          auVar124._8_4_ = auVar43._8_4_ + fStack_2c0;
          auVar124._12_4_ = auVar43._12_4_ + fStack_2bc;
          auVar39 = vshufps_avx(auVar39,auVar39,0);
          auVar142._0_4_ = auVar70._0_4_ * auVar39._0_4_;
          auVar142._4_4_ = auVar70._4_4_ * auVar39._4_4_;
          auVar142._8_4_ = auVar70._8_4_ * auVar39._8_4_;
          auVar142._12_4_ = auVar70._12_4_ * auVar39._12_4_;
          auVar41 = vsubps_avx(auVar77,auVar142);
          auVar39 = vrcpss_avx(auVar190,auVar190);
          auVar39 = ZEXT416((uint)(auVar39._0_4_ * (2.0 - fVar34 * auVar39._0_4_)));
          auVar39 = vshufps_avx(auVar39,auVar39,0);
          local_138._0_4_ =
               auVar71._0_4_ * fVar93 +
               auVar42._0_4_ * auVar73._0_4_ * auVar41._0_4_ * auVar39._0_4_;
          local_138._4_4_ =
               auVar71._4_4_ * fVar53 +
               auVar42._4_4_ * auVar73._4_4_ * auVar41._4_4_ * auVar39._4_4_;
          fStack_130 = auVar71._8_4_ * fVar54 +
                       auVar42._8_4_ * auVar73._8_4_ * auVar41._8_4_ * auVar39._8_4_;
          fStack_12c = auVar71._12_4_ * fVar55 +
                       auVar42._12_4_ * auVar73._12_4_ * auVar41._12_4_ * auVar39._12_4_;
          auVar39._0_4_ = (fVar95 + (float)local_138._0_4_) * 0.33333334;
          auVar39._4_4_ = (fVar122 + (float)local_138._4_4_) * 0.33333334;
          auVar39._8_4_ = (fVar133 + fStack_130) * 0.33333334;
          auVar39._12_4_ = (fVar134 + fStack_12c) * 0.33333334;
          auVar41 = vsubps_avx(auVar124,auVar39);
          auVar39 = vshufps_avx(auVar41,auVar41,0xaa);
          fVar93 = auVar39._0_4_;
          fVar34 = auVar39._4_4_;
          fVar53 = auVar39._8_4_;
          fVar54 = auVar39._12_4_;
          auVar39 = vshufps_avx(auVar124,auVar124,0xaa);
          fVar55 = auVar39._0_4_;
          fVar57 = auVar39._4_4_;
          fVar90 = auVar39._8_4_;
          fVar92 = auVar39._12_4_;
          auVar204._0_4_ = (float)local_1e8._0_4_ + auVar104._0_4_;
          auVar204._4_4_ = (float)local_1e8._4_4_ + auVar104._4_4_;
          auVar204._8_4_ = fStack_1e0 + auVar104._8_4_;
          auVar204._12_4_ = fStack_1dc + auVar104._12_4_;
          auVar177._0_4_ = auVar204._0_4_ + (fVar58 + (float)local_1c8._0_4_) * 0.33333334;
          auVar177._4_4_ = auVar204._4_4_ + (fVar56 + (float)local_1c8._4_4_) * 0.33333334;
          auVar177._8_4_ = auVar204._8_4_ + (fVar89 + fStack_1c0) * 0.33333334;
          auVar177._12_4_ = auVar204._12_4_ + (fVar91 + fStack_1bc) * 0.33333334;
          auVar39 = vshufps_avx(auVar177,auVar177,0xaa);
          fVar58 = auVar39._0_4_;
          fVar56 = auVar39._4_4_;
          fVar89 = auVar39._8_4_;
          auVar42 = vshufps_avx(auVar204,auVar204,0xaa);
          fVar91 = auVar42._0_4_;
          fVar94 = auVar42._4_4_;
          fVar95 = auVar42._8_4_;
          auVar84._0_4_ =
               fVar91 * (float)bezier_basis0._476_4_ +
               fVar58 * (float)bezier_basis0._1632_4_ +
               fVar93 * (float)bezier_basis0._2788_4_ + fVar55 * (float)bezier_basis0._3944_4_;
          auVar84._4_4_ =
               fVar94 * (float)bezier_basis0._480_4_ +
               fVar56 * (float)bezier_basis0._1636_4_ +
               fVar34 * (float)bezier_basis0._2792_4_ + fVar57 * (float)bezier_basis0._3948_4_;
          auVar84._8_4_ =
               fVar95 * (float)bezier_basis0._484_4_ +
               fVar89 * (float)bezier_basis0._1640_4_ +
               fVar53 * (float)bezier_basis0._2796_4_ + fVar90 * (float)bezier_basis0._3952_4_;
          auVar84._12_4_ =
               auVar42._12_4_ * (float)bezier_basis0._488_4_ +
               auVar39._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar54 * (float)bezier_basis0._2800_4_ + fVar92 * (float)bezier_basis0._3956_4_;
          auVar84._16_4_ =
               fVar91 * (float)bezier_basis0._492_4_ +
               fVar58 * (float)bezier_basis0._1648_4_ +
               fVar93 * (float)bezier_basis0._2804_4_ + fVar55 * (float)bezier_basis0._3960_4_;
          auVar84._20_4_ =
               fVar94 * (float)bezier_basis0._496_4_ +
               fVar56 * (float)bezier_basis0._1652_4_ +
               fVar34 * (float)bezier_basis0._2808_4_ + fVar57 * (float)bezier_basis0._3964_4_;
          auVar84._24_4_ =
               fVar95 * (float)bezier_basis0._500_4_ +
               fVar89 * (float)bezier_basis0._1656_4_ +
               fVar53 * (float)bezier_basis0._2812_4_ + fVar90 * (float)bezier_basis0._3968_4_;
          auVar84._28_4_ = (float)bezier_basis0._2816_4_ + (float)bezier_basis0._3972_4_ + 0.0 + 0.0
          ;
          auVar49._0_4_ =
               fVar91 * (float)bezier_basis0._5100_4_ +
               fVar58 * (float)bezier_basis0._6256_4_ +
               fVar93 * (float)bezier_basis0._7412_4_ + fVar55 * (float)bezier_basis0._8568_4_;
          auVar49._4_4_ =
               fVar94 * (float)bezier_basis0._5104_4_ +
               fVar56 * (float)bezier_basis0._6260_4_ +
               fVar34 * (float)bezier_basis0._7416_4_ + fVar57 * (float)bezier_basis0._8572_4_;
          auVar49._8_4_ =
               fVar95 * (float)bezier_basis0._5108_4_ +
               fVar89 * (float)bezier_basis0._6264_4_ +
               fVar53 * (float)bezier_basis0._7420_4_ + fVar90 * (float)bezier_basis0._8576_4_;
          auVar49._12_4_ =
               auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar39._12_4_ * (float)bezier_basis0._6268_4_ +
               fVar54 * (float)bezier_basis0._7424_4_ + fVar92 * (float)bezier_basis0._8580_4_;
          auVar49._16_4_ =
               fVar91 * (float)bezier_basis0._5116_4_ +
               fVar58 * (float)bezier_basis0._6272_4_ +
               fVar93 * (float)bezier_basis0._7428_4_ + fVar55 * (float)bezier_basis0._8584_4_;
          auVar49._20_4_ =
               fVar94 * (float)bezier_basis0._5120_4_ +
               fVar56 * (float)bezier_basis0._6276_4_ +
               fVar34 * (float)bezier_basis0._7432_4_ + fVar57 * (float)bezier_basis0._8588_4_;
          auVar49._24_4_ =
               fVar95 * (float)bezier_basis0._5124_4_ +
               fVar89 * (float)bezier_basis0._6280_4_ +
               fVar53 * (float)bezier_basis0._7436_4_ + fVar90 * (float)bezier_basis0._8592_4_;
          auVar49._28_4_ = fVar92 + fVar92 + fVar54 + fVar92;
          auVar50 = vblendps_avx(auVar49,ZEXT832(0) << 0x20,1);
          auVar14._4_4_ = auVar50._4_4_ * 0.055555556;
          auVar14._0_4_ = auVar50._0_4_ * 0.055555556;
          auVar14._8_4_ = auVar50._8_4_ * 0.055555556;
          auVar14._12_4_ = auVar50._12_4_ * 0.055555556;
          auVar14._16_4_ = auVar50._16_4_ * 0.055555556;
          auVar14._20_4_ = auVar50._20_4_ * 0.055555556;
          auVar14._24_4_ = auVar50._24_4_ * 0.055555556;
          auVar14._28_4_ = auVar50._28_4_;
          auVar17 = vsubps_avx(auVar84,auVar14);
          auVar50 = vblendps_avx(auVar49,ZEXT832(0) << 0x20,0x80);
          auVar145._0_4_ = auVar84._0_4_ + auVar50._0_4_ * 0.055555556;
          auVar145._4_4_ = auVar84._4_4_ + auVar50._4_4_ * 0.055555556;
          auVar145._8_4_ = auVar84._8_4_ + auVar50._8_4_ * 0.055555556;
          auVar145._12_4_ = auVar84._12_4_ + auVar50._12_4_ * 0.055555556;
          auVar145._16_4_ = auVar84._16_4_ + auVar50._16_4_ * 0.055555556;
          auVar145._20_4_ = auVar84._20_4_ + auVar50._20_4_ * 0.055555556;
          auVar145._24_4_ = auVar84._24_4_ + auVar50._24_4_ * 0.055555556;
          auVar145._28_4_ = auVar84._28_4_ + auVar50._28_4_;
          auVar50._8_4_ = 0xff800000;
          auVar50._0_8_ = 0xff800000ff800000;
          auVar50._12_4_ = 0xff800000;
          auVar50._16_4_ = 0xff800000;
          auVar50._20_4_ = 0xff800000;
          auVar50._24_4_ = 0xff800000;
          auVar50._28_4_ = 0xff800000;
          auVar50 = vmaxps_avx(auVar50,auVar84);
          auVar14 = vmaxps_avx(auVar17,auVar145);
          auVar14 = vmaxps_avx(auVar50,auVar14);
          auVar39 = vshufps_avx(auVar41,auVar41,0x55);
          auVar42 = vshufps_avx(auVar124,auVar124,0x55);
          fVar58 = auVar39._0_4_;
          fVar56 = auVar39._4_4_;
          fVar89 = auVar39._8_4_;
          fVar91 = auVar39._12_4_;
          fVar93 = auVar42._0_4_;
          fVar34 = auVar42._4_4_;
          fVar53 = auVar42._8_4_;
          fVar54 = auVar42._12_4_;
          auVar39 = vshufps_avx(auVar177,auVar177,0x55);
          fVar92 = auVar39._0_4_;
          fVar94 = auVar39._4_4_;
          fVar95 = auVar39._8_4_;
          auVar42 = vshufps_avx(auVar204,auVar204,0x55);
          fVar55 = auVar42._0_4_;
          fVar57 = auVar42._4_4_;
          fVar90 = auVar42._8_4_;
          auVar51._0_4_ =
               fVar55 * (float)bezier_basis0._476_4_ +
               fVar92 * (float)bezier_basis0._1632_4_ +
               fVar93 * (float)bezier_basis0._3944_4_ + fVar58 * (float)bezier_basis0._2788_4_;
          auVar51._4_4_ =
               fVar57 * (float)bezier_basis0._480_4_ +
               fVar94 * (float)bezier_basis0._1636_4_ +
               fVar34 * (float)bezier_basis0._3948_4_ + fVar56 * (float)bezier_basis0._2792_4_;
          auVar51._8_4_ =
               fVar90 * (float)bezier_basis0._484_4_ +
               fVar95 * (float)bezier_basis0._1640_4_ +
               fVar53 * (float)bezier_basis0._3952_4_ + fVar89 * (float)bezier_basis0._2796_4_;
          auVar51._12_4_ =
               auVar42._12_4_ * (float)bezier_basis0._488_4_ +
               auVar39._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar54 * (float)bezier_basis0._3956_4_ + fVar91 * (float)bezier_basis0._2800_4_;
          auVar51._16_4_ =
               fVar55 * (float)bezier_basis0._492_4_ +
               fVar92 * (float)bezier_basis0._1648_4_ +
               fVar93 * (float)bezier_basis0._3960_4_ + fVar58 * (float)bezier_basis0._2804_4_;
          auVar51._20_4_ =
               fVar57 * (float)bezier_basis0._496_4_ +
               fVar94 * (float)bezier_basis0._1652_4_ +
               fVar34 * (float)bezier_basis0._3964_4_ + fVar56 * (float)bezier_basis0._2808_4_;
          auVar51._24_4_ =
               fVar90 * (float)bezier_basis0._500_4_ +
               fVar95 * (float)bezier_basis0._1656_4_ +
               fVar53 * (float)bezier_basis0._3968_4_ + fVar89 * (float)bezier_basis0._2812_4_;
          auVar51._28_4_ = 0;
          auVar110._0_4_ =
               fVar55 * (float)bezier_basis0._5100_4_ +
               fVar92 * (float)bezier_basis0._6256_4_ +
               fVar58 * (float)bezier_basis0._7412_4_ + fVar93 * (float)bezier_basis0._8568_4_;
          auVar110._4_4_ =
               fVar57 * (float)bezier_basis0._5104_4_ +
               fVar94 * (float)bezier_basis0._6260_4_ +
               fVar56 * (float)bezier_basis0._7416_4_ + fVar34 * (float)bezier_basis0._8572_4_;
          auVar110._8_4_ =
               fVar90 * (float)bezier_basis0._5108_4_ +
               fVar95 * (float)bezier_basis0._6264_4_ +
               fVar89 * (float)bezier_basis0._7420_4_ + fVar53 * (float)bezier_basis0._8576_4_;
          auVar110._12_4_ =
               auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar39._12_4_ * (float)bezier_basis0._6268_4_ +
               fVar91 * (float)bezier_basis0._7424_4_ + fVar54 * (float)bezier_basis0._8580_4_;
          auVar110._16_4_ =
               fVar55 * (float)bezier_basis0._5116_4_ +
               fVar92 * (float)bezier_basis0._6272_4_ +
               fVar58 * (float)bezier_basis0._7428_4_ + fVar93 * (float)bezier_basis0._8584_4_;
          auVar110._20_4_ =
               fVar57 * (float)bezier_basis0._5120_4_ +
               fVar94 * (float)bezier_basis0._6276_4_ +
               fVar56 * (float)bezier_basis0._7432_4_ + fVar34 * (float)bezier_basis0._8588_4_;
          auVar110._24_4_ =
               fVar90 * (float)bezier_basis0._5124_4_ +
               fVar95 * (float)bezier_basis0._6280_4_ +
               fVar89 * (float)bezier_basis0._7436_4_ + fVar53 * (float)bezier_basis0._8592_4_;
          auVar110._28_4_ = fVar54 + fVar54 + fVar91 + fVar54;
          auVar50 = vblendps_avx(auVar110,ZEXT432(0) << 0x20,1);
          auVar15._4_4_ = auVar50._4_4_ * 0.055555556;
          auVar15._0_4_ = auVar50._0_4_ * 0.055555556;
          auVar15._8_4_ = auVar50._8_4_ * 0.055555556;
          auVar15._12_4_ = auVar50._12_4_ * 0.055555556;
          auVar15._16_4_ = auVar50._16_4_ * 0.055555556;
          auVar15._20_4_ = auVar50._20_4_ * 0.055555556;
          auVar15._24_4_ = auVar50._24_4_ * 0.055555556;
          auVar15._28_4_ = auVar50._28_4_;
          auVar18 = vsubps_avx(auVar51,auVar15);
          auVar50 = vblendps_avx(auVar110,ZEXT432(0) << 0x20,0x80);
          auVar111._0_4_ = auVar51._0_4_ + auVar50._0_4_ * 0.055555556;
          auVar111._4_4_ = auVar51._4_4_ + auVar50._4_4_ * 0.055555556;
          auVar111._8_4_ = auVar51._8_4_ + auVar50._8_4_ * 0.055555556;
          auVar111._12_4_ = auVar51._12_4_ + auVar50._12_4_ * 0.055555556;
          auVar111._16_4_ = auVar51._16_4_ + auVar50._16_4_ * 0.055555556;
          auVar111._20_4_ = auVar51._20_4_ + auVar50._20_4_ * 0.055555556;
          auVar111._24_4_ = auVar51._24_4_ + auVar50._24_4_ * 0.055555556;
          auVar111._28_4_ = auVar50._28_4_ + 0.0;
          auVar164._8_4_ = 0xff800000;
          auVar164._0_8_ = 0xff800000ff800000;
          auVar164._12_4_ = 0xff800000;
          auVar164._16_4_ = 0xff800000;
          auVar164._20_4_ = 0xff800000;
          auVar164._24_4_ = 0xff800000;
          auVar164._28_4_ = 0xff800000;
          auVar50 = vmaxps_avx(auVar164,auVar51);
          auVar15 = vmaxps_avx(auVar18,auVar111);
          auVar49 = vmaxps_avx(auVar50,auVar15);
          auVar39 = vpermilps_avx(auVar41,0);
          auVar42 = vpermilps_avx(auVar124,0);
          fVar95 = auVar39._0_4_;
          fVar96 = auVar39._4_4_;
          fVar113 = auVar39._8_4_;
          fVar114 = auVar39._12_4_;
          fVar57 = auVar42._0_4_;
          fVar90 = auVar42._4_4_;
          fVar92 = auVar42._8_4_;
          fVar94 = auVar42._12_4_;
          fVar55 = auVar15._28_4_;
          auVar39 = vpermilps_avx(auVar177,0);
          fVar58 = auVar39._0_4_;
          fVar89 = auVar39._4_4_;
          fVar93 = auVar39._8_4_;
          fVar53 = auVar39._12_4_;
          auVar39 = vshufps_avx(auVar204,auVar204,0);
          fVar56 = auVar39._0_4_;
          fVar91 = auVar39._4_4_;
          fVar34 = auVar39._8_4_;
          fVar54 = auVar39._12_4_;
          auVar172._0_4_ =
               (float)bezier_basis0._476_4_ * fVar56 +
               (float)bezier_basis0._1632_4_ * fVar58 +
               fVar95 * (float)bezier_basis0._2788_4_ + fVar57 * (float)bezier_basis0._3944_4_;
          auVar172._4_4_ =
               (float)bezier_basis0._480_4_ * fVar91 +
               (float)bezier_basis0._1636_4_ * fVar89 +
               fVar96 * (float)bezier_basis0._2792_4_ + fVar90 * (float)bezier_basis0._3948_4_;
          auVar172._8_4_ =
               (float)bezier_basis0._484_4_ * fVar34 +
               (float)bezier_basis0._1640_4_ * fVar93 +
               fVar113 * (float)bezier_basis0._2796_4_ + fVar92 * (float)bezier_basis0._3952_4_;
          auVar172._12_4_ =
               (float)bezier_basis0._488_4_ * fVar54 +
               (float)bezier_basis0._1644_4_ * fVar53 +
               fVar114 * (float)bezier_basis0._2800_4_ + fVar94 * (float)bezier_basis0._3956_4_;
          auVar172._16_4_ =
               (float)bezier_basis0._492_4_ * fVar56 +
               (float)bezier_basis0._1648_4_ * fVar58 +
               fVar95 * (float)bezier_basis0._2804_4_ + fVar57 * (float)bezier_basis0._3960_4_;
          auVar172._20_4_ =
               (float)bezier_basis0._496_4_ * fVar91 +
               (float)bezier_basis0._1652_4_ * fVar89 +
               fVar96 * (float)bezier_basis0._2808_4_ + fVar90 * (float)bezier_basis0._3964_4_;
          auVar172._24_4_ =
               (float)bezier_basis0._500_4_ * fVar34 +
               (float)bezier_basis0._1656_4_ * fVar93 +
               fVar113 * (float)bezier_basis0._2812_4_ + fVar92 * (float)bezier_basis0._3968_4_;
          auVar172._28_4_ = fVar55 + fVar55 + auVar49._28_4_ + fVar55;
          auVar85._0_4_ =
               (float)bezier_basis0._5100_4_ * fVar56 +
               (float)bezier_basis0._6256_4_ * fVar58 +
               fVar95 * (float)bezier_basis0._7412_4_ + (float)bezier_basis0._8568_4_ * fVar57;
          auVar85._4_4_ =
               (float)bezier_basis0._5104_4_ * fVar91 +
               (float)bezier_basis0._6260_4_ * fVar89 +
               fVar96 * (float)bezier_basis0._7416_4_ + (float)bezier_basis0._8572_4_ * fVar90;
          auVar85._8_4_ =
               (float)bezier_basis0._5108_4_ * fVar34 +
               (float)bezier_basis0._6264_4_ * fVar93 +
               fVar113 * (float)bezier_basis0._7420_4_ + (float)bezier_basis0._8576_4_ * fVar92;
          auVar85._12_4_ =
               (float)bezier_basis0._5112_4_ * fVar54 +
               (float)bezier_basis0._6268_4_ * fVar53 +
               fVar114 * (float)bezier_basis0._7424_4_ + (float)bezier_basis0._8580_4_ * fVar94;
          auVar85._16_4_ =
               (float)bezier_basis0._5116_4_ * fVar56 +
               (float)bezier_basis0._6272_4_ * fVar58 +
               fVar95 * (float)bezier_basis0._7428_4_ + (float)bezier_basis0._8584_4_ * fVar57;
          auVar85._20_4_ =
               (float)bezier_basis0._5120_4_ * fVar91 +
               (float)bezier_basis0._6276_4_ * fVar89 +
               fVar96 * (float)bezier_basis0._7432_4_ + (float)bezier_basis0._8588_4_ * fVar90;
          auVar85._24_4_ =
               (float)bezier_basis0._5124_4_ * fVar34 +
               (float)bezier_basis0._6280_4_ * fVar93 +
               fVar113 * (float)bezier_basis0._7436_4_ + (float)bezier_basis0._8592_4_ * fVar92;
          auVar85._28_4_ = fVar54 + fVar53 + fVar114 + fVar94;
          auVar50 = vblendps_avx(auVar85,ZEXT432(0) << 0x20,1);
          auVar16._4_4_ = auVar50._4_4_ * 0.055555556;
          auVar16._0_4_ = auVar50._0_4_ * 0.055555556;
          auVar16._8_4_ = auVar50._8_4_ * 0.055555556;
          auVar16._12_4_ = auVar50._12_4_ * 0.055555556;
          auVar16._16_4_ = auVar50._16_4_ * 0.055555556;
          auVar16._20_4_ = auVar50._20_4_ * 0.055555556;
          auVar16._24_4_ = auVar50._24_4_ * 0.055555556;
          auVar16._28_4_ = auVar50._28_4_;
          auVar110 = vsubps_avx(auVar172,auVar16);
          auVar50 = vblendps_avx(auVar85,ZEXT432(0) << 0x20,0x80);
          auVar86._0_4_ = auVar172._0_4_ + auVar50._0_4_ * 0.055555556;
          auVar86._4_4_ = auVar172._4_4_ + auVar50._4_4_ * 0.055555556;
          auVar86._8_4_ = auVar172._8_4_ + auVar50._8_4_ * 0.055555556;
          auVar86._12_4_ = auVar172._12_4_ + auVar50._12_4_ * 0.055555556;
          auVar86._16_4_ = auVar172._16_4_ + auVar50._16_4_ * 0.055555556;
          auVar86._20_4_ = auVar172._20_4_ + auVar50._20_4_ * 0.055555556;
          auVar86._24_4_ = auVar172._24_4_ + auVar50._24_4_ * 0.055555556;
          auVar86._28_4_ = auVar172._28_4_ + auVar50._28_4_;
          auVar50 = vmaxps_avx(auVar164,auVar172);
          auVar15 = vmaxps_avx(auVar110,auVar86);
          auVar15 = vmaxps_avx(auVar50,auVar15);
          auVar50 = vminps_avx(auVar17,auVar145);
          auVar155._8_4_ = 0x7f800000;
          auVar155._0_8_ = 0x7f8000007f800000;
          auVar155._12_4_ = 0x7f800000;
          auVar155._16_4_ = 0x7f800000;
          auVar155._20_4_ = 0x7f800000;
          auVar155._24_4_ = 0x7f800000;
          auVar155._28_4_ = 0x7f800000;
          auVar17 = vminps_avx(auVar155,auVar84);
          auVar16 = vminps_avx(auVar17,auVar50);
          auVar50 = vminps_avx(auVar18,auVar111);
          auVar17 = vminps_avx(auVar155,auVar51);
          auVar18 = vminps_avx(auVar17,auVar50);
          auVar50 = vminps_avx(auVar110,auVar86);
          auVar17 = vminps_avx(auVar155,auVar172);
          auVar110 = vminps_avx(auVar17,auVar50);
          auVar70 = vsubps_avx(auVar104,_local_1e8);
          auVar41 = vsubps_avx(auVar78,_local_1c8);
          auVar73 = vsubps_avx(auVar43,_local_2c8);
          auVar39 = vsubps_avx(auVar67,_local_138);
          auVar78._0_4_ = auVar39._0_4_ * 0.33333334;
          auVar78._4_4_ = auVar39._4_4_ * 0.33333334;
          auVar78._8_4_ = auVar39._8_4_ * 0.33333334;
          auVar78._12_4_ = auVar39._12_4_ * 0.33333334;
          auVar71 = vsubps_avx(auVar73,auVar78);
          auVar39 = vshufps_avx(auVar71,auVar71,0);
          auVar42 = vshufps_avx(auVar73,auVar73,0);
          fVar58 = auVar39._0_4_;
          fVar89 = auVar39._4_4_;
          fVar93 = auVar39._8_4_;
          fVar53 = auVar39._12_4_;
          fVar56 = auVar42._0_4_;
          fVar91 = auVar42._4_4_;
          fVar34 = auVar42._8_4_;
          fVar54 = auVar42._12_4_;
          auVar44._0_4_ = auVar70._0_4_ + auVar41._0_4_ * 0.33333334;
          auVar44._4_4_ = auVar70._4_4_ + auVar41._4_4_ * 0.33333334;
          auVar44._8_4_ = auVar70._8_4_ + auVar41._8_4_ * 0.33333334;
          auVar44._12_4_ = auVar70._12_4_ + auVar41._12_4_ * 0.33333334;
          auVar39 = vshufps_avx(auVar44,auVar44,0);
          fVar92 = auVar39._0_4_;
          fVar94 = auVar39._4_4_;
          fVar95 = auVar39._8_4_;
          auVar42 = vshufps_avx(auVar70,auVar70,0);
          fVar55 = auVar42._0_4_;
          fVar57 = auVar42._4_4_;
          fVar90 = auVar42._8_4_;
          auVar199._0_4_ =
               fVar55 * (float)bezier_basis0._476_4_ +
               fVar92 * (float)bezier_basis0._1632_4_ +
               (float)bezier_basis0._2788_4_ * fVar58 + (float)bezier_basis0._3944_4_ * fVar56;
          auVar199._4_4_ =
               fVar57 * (float)bezier_basis0._480_4_ +
               fVar94 * (float)bezier_basis0._1636_4_ +
               (float)bezier_basis0._2792_4_ * fVar89 + (float)bezier_basis0._3948_4_ * fVar91;
          auVar199._8_4_ =
               fVar90 * (float)bezier_basis0._484_4_ +
               fVar95 * (float)bezier_basis0._1640_4_ +
               (float)bezier_basis0._2796_4_ * fVar93 + (float)bezier_basis0._3952_4_ * fVar34;
          auVar199._12_4_ =
               auVar42._12_4_ * (float)bezier_basis0._488_4_ +
               auVar39._12_4_ * (float)bezier_basis0._1644_4_ +
               (float)bezier_basis0._2800_4_ * fVar53 + (float)bezier_basis0._3956_4_ * fVar54;
          auVar199._16_4_ =
               fVar55 * (float)bezier_basis0._492_4_ +
               fVar92 * (float)bezier_basis0._1648_4_ +
               (float)bezier_basis0._2804_4_ * fVar58 + (float)bezier_basis0._3960_4_ * fVar56;
          auVar199._20_4_ =
               fVar57 * (float)bezier_basis0._496_4_ +
               fVar94 * (float)bezier_basis0._1652_4_ +
               (float)bezier_basis0._2808_4_ * fVar89 + (float)bezier_basis0._3964_4_ * fVar91;
          auVar199._24_4_ =
               fVar90 * (float)bezier_basis0._500_4_ +
               fVar95 * (float)bezier_basis0._1656_4_ +
               (float)bezier_basis0._2812_4_ * fVar93 + (float)bezier_basis0._3968_4_ * fVar34;
          auVar199._28_4_ = auVar16._28_4_ + 0.0 + 0.0 + INFINITY;
          auVar129._0_4_ =
               fVar55 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar92 +
               (float)bezier_basis0._7412_4_ * fVar58 + (float)bezier_basis0._8568_4_ * fVar56;
          auVar129._4_4_ =
               fVar57 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar94 +
               (float)bezier_basis0._7416_4_ * fVar89 + (float)bezier_basis0._8572_4_ * fVar91;
          auVar129._8_4_ =
               fVar90 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar95 +
               (float)bezier_basis0._7420_4_ * fVar93 + (float)bezier_basis0._8576_4_ * fVar34;
          auVar129._12_4_ =
               auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * auVar39._12_4_ +
               (float)bezier_basis0._7424_4_ * fVar53 + (float)bezier_basis0._8580_4_ * fVar54;
          auVar129._16_4_ =
               fVar55 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar92 +
               (float)bezier_basis0._7428_4_ * fVar58 + (float)bezier_basis0._8584_4_ * fVar56;
          auVar129._20_4_ =
               fVar57 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar94 +
               (float)bezier_basis0._7432_4_ * fVar89 + (float)bezier_basis0._8588_4_ * fVar91;
          auVar129._24_4_ =
               fVar90 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar95 +
               (float)bezier_basis0._7436_4_ * fVar93 + (float)bezier_basis0._8592_4_ * fVar34;
          auVar129._28_4_ = fVar54 + fVar54 + fVar53 + fVar54;
          auVar50 = vblendps_avx(auVar129,ZEXT832(0) << 0x20,1);
          auVar17._4_4_ = auVar50._4_4_ * 0.055555556;
          auVar17._0_4_ = auVar50._0_4_ * 0.055555556;
          auVar17._8_4_ = auVar50._8_4_ * 0.055555556;
          auVar17._12_4_ = auVar50._12_4_ * 0.055555556;
          auVar17._16_4_ = auVar50._16_4_ * 0.055555556;
          auVar17._20_4_ = auVar50._20_4_ * 0.055555556;
          auVar17._24_4_ = auVar50._24_4_ * 0.055555556;
          auVar17._28_4_ = auVar50._28_4_;
          auVar51 = vsubps_avx(auVar199,auVar17);
          auVar50 = vblendps_avx(auVar129,ZEXT832(0) << 0x20,0x80);
          auVar139._0_4_ = auVar199._0_4_ + auVar50._0_4_ * 0.055555556;
          auVar139._4_4_ = auVar199._4_4_ + auVar50._4_4_ * 0.055555556;
          auVar139._8_4_ = auVar199._8_4_ + auVar50._8_4_ * 0.055555556;
          auVar139._12_4_ = auVar199._12_4_ + auVar50._12_4_ * 0.055555556;
          auVar139._16_4_ = auVar199._16_4_ + auVar50._16_4_ * 0.055555556;
          auVar139._20_4_ = auVar199._20_4_ + auVar50._20_4_ * 0.055555556;
          auVar139._24_4_ = auVar199._24_4_ + auVar50._24_4_ * 0.055555556;
          auVar139._28_4_ = auVar199._28_4_ + auVar50._28_4_;
          auVar130._8_4_ = 0xff800000;
          auVar130._0_8_ = 0xff800000ff800000;
          auVar130._12_4_ = 0xff800000;
          auVar130._16_4_ = 0xff800000;
          auVar130._20_4_ = 0xff800000;
          auVar130._24_4_ = 0xff800000;
          auVar130._28_4_ = 0xff800000;
          auVar50 = vmaxps_avx(auVar130,auVar199);
          auVar17 = vmaxps_avx(auVar51,auVar139);
          auVar50 = vmaxps_avx(auVar50,auVar17);
          auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
          auVar50 = vmaxps_avx(auVar50,auVar17);
          auVar17 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vmaxps_avx(auVar50,auVar17);
          auVar39 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar42 = vshufps_avx(auVar71,auVar71,0x55);
          auVar41 = vshufps_avx(auVar73,auVar73,0x55);
          fVar58 = auVar42._0_4_;
          fVar89 = auVar42._4_4_;
          fVar93 = auVar42._8_4_;
          fVar53 = auVar42._12_4_;
          fVar56 = auVar41._0_4_;
          fVar91 = auVar41._4_4_;
          fVar34 = auVar41._8_4_;
          fVar54 = auVar41._12_4_;
          auVar42 = vshufps_avx(auVar44,auVar44,0x55);
          fVar55 = auVar42._0_4_;
          fVar57 = auVar42._4_4_;
          fVar90 = auVar42._8_4_;
          auVar41 = vshufps_avx(auVar70,auVar70,0x55);
          fVar92 = auVar41._0_4_;
          fVar94 = auVar41._4_4_;
          fVar95 = auVar41._8_4_;
          auVar146._0_4_ =
               fVar92 * (float)bezier_basis0._476_4_ +
               fVar55 * (float)bezier_basis0._1632_4_ +
               (float)bezier_basis0._2788_4_ * fVar58 + (float)bezier_basis0._3944_4_ * fVar56;
          auVar146._4_4_ =
               fVar94 * (float)bezier_basis0._480_4_ +
               fVar57 * (float)bezier_basis0._1636_4_ +
               (float)bezier_basis0._2792_4_ * fVar89 + (float)bezier_basis0._3948_4_ * fVar91;
          auVar146._8_4_ =
               fVar95 * (float)bezier_basis0._484_4_ +
               fVar90 * (float)bezier_basis0._1640_4_ +
               (float)bezier_basis0._2796_4_ * fVar93 + (float)bezier_basis0._3952_4_ * fVar34;
          auVar146._12_4_ =
               auVar41._12_4_ * (float)bezier_basis0._488_4_ +
               auVar42._12_4_ * (float)bezier_basis0._1644_4_ +
               (float)bezier_basis0._2800_4_ * fVar53 + (float)bezier_basis0._3956_4_ * fVar54;
          auVar146._16_4_ =
               fVar92 * (float)bezier_basis0._492_4_ +
               fVar55 * (float)bezier_basis0._1648_4_ +
               (float)bezier_basis0._2804_4_ * fVar58 + (float)bezier_basis0._3960_4_ * fVar56;
          auVar146._20_4_ =
               fVar94 * (float)bezier_basis0._496_4_ +
               fVar57 * (float)bezier_basis0._1652_4_ +
               (float)bezier_basis0._2808_4_ * fVar89 + (float)bezier_basis0._3964_4_ * fVar91;
          auVar146._24_4_ =
               fVar95 * (float)bezier_basis0._500_4_ +
               fVar90 * (float)bezier_basis0._1656_4_ +
               (float)bezier_basis0._2812_4_ * fVar93 + (float)bezier_basis0._3968_4_ * fVar34;
          auVar146._28_4_ =
               (float)bezier_basis0._3972_4_ + (float)bezier_basis0._2816_4_ + auVar51._28_4_ + 0.0;
          auVar131._0_4_ =
               fVar92 * (float)bezier_basis0._5100_4_ +
               fVar55 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar58 + (float)bezier_basis0._8568_4_ * fVar56;
          auVar131._4_4_ =
               fVar94 * (float)bezier_basis0._5104_4_ +
               fVar57 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar89 + (float)bezier_basis0._8572_4_ * fVar91;
          auVar131._8_4_ =
               fVar95 * (float)bezier_basis0._5108_4_ +
               fVar90 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar93 + (float)bezier_basis0._8576_4_ * fVar34;
          auVar131._12_4_ =
               auVar41._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar42._12_4_ * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar53 + (float)bezier_basis0._8580_4_ * fVar54;
          auVar131._16_4_ =
               fVar92 * (float)bezier_basis0._5116_4_ +
               fVar55 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar58 + (float)bezier_basis0._8584_4_ * fVar56;
          auVar131._20_4_ =
               fVar94 * (float)bezier_basis0._5120_4_ +
               fVar57 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar89 + (float)bezier_basis0._8588_4_ * fVar91;
          auVar131._24_4_ =
               fVar95 * (float)bezier_basis0._5124_4_ +
               fVar90 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar93 + (float)bezier_basis0._8592_4_ * fVar34;
          auVar131._28_4_ = fVar54 + fVar54 + fVar53 + fVar54;
          auVar50 = vblendps_avx(auVar131,ZEXT832(0) << 0x20,1);
          auVar19._4_4_ = auVar50._4_4_ * 0.055555556;
          auVar19._0_4_ = auVar50._0_4_ * 0.055555556;
          auVar19._8_4_ = auVar50._8_4_ * 0.055555556;
          auVar19._12_4_ = auVar50._12_4_ * 0.055555556;
          auVar19._16_4_ = auVar50._16_4_ * 0.055555556;
          auVar19._20_4_ = auVar50._20_4_ * 0.055555556;
          auVar19._24_4_ = auVar50._24_4_ * 0.055555556;
          auVar19._28_4_ = auVar50._28_4_;
          auVar19 = vsubps_avx(auVar146,auVar19);
          auVar50 = vblendps_avx(auVar131,ZEXT832(0) << 0x20,0x80);
          auVar132._0_4_ = auVar146._0_4_ + auVar50._0_4_ * 0.055555556;
          auVar132._4_4_ = auVar146._4_4_ + auVar50._4_4_ * 0.055555556;
          auVar132._8_4_ = auVar146._8_4_ + auVar50._8_4_ * 0.055555556;
          auVar132._12_4_ = auVar146._12_4_ + auVar50._12_4_ * 0.055555556;
          auVar132._16_4_ = auVar146._16_4_ + auVar50._16_4_ * 0.055555556;
          auVar132._20_4_ = auVar146._20_4_ + auVar50._20_4_ * 0.055555556;
          auVar132._24_4_ = auVar146._24_4_ + auVar50._24_4_ * 0.055555556;
          auVar132._28_4_ = auVar146._28_4_ + auVar50._28_4_;
          auVar87._8_4_ = 0xff800000;
          auVar87._0_8_ = 0xff800000ff800000;
          auVar87._12_4_ = 0xff800000;
          auVar87._16_4_ = 0xff800000;
          auVar87._20_4_ = 0xff800000;
          auVar87._24_4_ = 0xff800000;
          auVar87._28_4_ = 0xff800000;
          auVar50 = vmaxps_avx(auVar87,auVar146);
          auVar17 = vmaxps_avx(auVar19,auVar132);
          auVar50 = vmaxps_avx(auVar50,auVar17);
          auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
          auVar50 = vmaxps_avx(auVar50,auVar17);
          auVar17 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vmaxps_avx(auVar50,auVar17);
          auVar42 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar42 = vunpcklps_avx(auVar39,auVar42);
          auVar39 = vshufps_avx(auVar71,auVar71,0xaa);
          fVar93 = auVar39._0_4_;
          fVar34 = auVar39._4_4_;
          fVar53 = auVar39._8_4_;
          fVar54 = auVar39._12_4_;
          auVar39 = vshufps_avx(auVar73,auVar73,0xaa);
          fVar94 = auVar39._0_4_;
          fVar95 = auVar39._4_4_;
          fVar96 = auVar39._8_4_;
          fVar113 = auVar39._12_4_;
          auVar39 = vshufps_avx(auVar44,auVar44,0xaa);
          fVar58 = auVar39._0_4_;
          fVar56 = auVar39._4_4_;
          fVar89 = auVar39._8_4_;
          fVar91 = auVar39._12_4_;
          auVar39 = vshufps_avx(auVar70,auVar70,0xaa);
          fVar55 = auVar39._0_4_;
          fVar57 = auVar39._4_4_;
          fVar90 = auVar39._8_4_;
          fVar92 = auVar39._12_4_;
          auVar112._0_4_ =
               fVar55 * (float)bezier_basis0._476_4_ +
               fVar58 * (float)bezier_basis0._1632_4_ +
               fVar93 * (float)bezier_basis0._2788_4_ + fVar94 * (float)bezier_basis0._3944_4_;
          auVar112._4_4_ =
               fVar57 * (float)bezier_basis0._480_4_ +
               fVar56 * (float)bezier_basis0._1636_4_ +
               fVar34 * (float)bezier_basis0._2792_4_ + fVar95 * (float)bezier_basis0._3948_4_;
          auVar112._8_4_ =
               fVar90 * (float)bezier_basis0._484_4_ +
               fVar89 * (float)bezier_basis0._1640_4_ +
               fVar53 * (float)bezier_basis0._2796_4_ + fVar96 * (float)bezier_basis0._3952_4_;
          auVar112._12_4_ =
               fVar92 * (float)bezier_basis0._488_4_ +
               fVar91 * (float)bezier_basis0._1644_4_ +
               fVar54 * (float)bezier_basis0._2800_4_ + fVar113 * (float)bezier_basis0._3956_4_;
          auVar112._16_4_ =
               fVar55 * (float)bezier_basis0._492_4_ +
               fVar58 * (float)bezier_basis0._1648_4_ +
               fVar93 * (float)bezier_basis0._2804_4_ + fVar94 * (float)bezier_basis0._3960_4_;
          auVar112._20_4_ =
               fVar57 * (float)bezier_basis0._496_4_ +
               fVar56 * (float)bezier_basis0._1652_4_ +
               fVar34 * (float)bezier_basis0._2808_4_ + fVar95 * (float)bezier_basis0._3964_4_;
          auVar112._24_4_ =
               fVar90 * (float)bezier_basis0._500_4_ +
               fVar89 * (float)bezier_basis0._1656_4_ +
               fVar53 * (float)bezier_basis0._2812_4_ + fVar96 * (float)bezier_basis0._3968_4_;
          auVar112._28_4_ = 0;
          auVar88._0_4_ =
               fVar55 * (float)bezier_basis0._5100_4_ +
               fVar58 * (float)bezier_basis0._6256_4_ +
               fVar94 * (float)bezier_basis0._8568_4_ + fVar93 * (float)bezier_basis0._7412_4_;
          auVar88._4_4_ =
               fVar57 * (float)bezier_basis0._5104_4_ +
               fVar56 * (float)bezier_basis0._6260_4_ +
               fVar95 * (float)bezier_basis0._8572_4_ + fVar34 * (float)bezier_basis0._7416_4_;
          auVar88._8_4_ =
               fVar90 * (float)bezier_basis0._5108_4_ +
               fVar89 * (float)bezier_basis0._6264_4_ +
               fVar96 * (float)bezier_basis0._8576_4_ + fVar53 * (float)bezier_basis0._7420_4_;
          auVar88._12_4_ =
               fVar92 * (float)bezier_basis0._5112_4_ +
               fVar91 * (float)bezier_basis0._6268_4_ +
               fVar113 * (float)bezier_basis0._8580_4_ + fVar54 * (float)bezier_basis0._7424_4_;
          auVar88._16_4_ =
               fVar55 * (float)bezier_basis0._5116_4_ +
               fVar58 * (float)bezier_basis0._6272_4_ +
               fVar94 * (float)bezier_basis0._8584_4_ + fVar93 * (float)bezier_basis0._7428_4_;
          auVar88._20_4_ =
               fVar57 * (float)bezier_basis0._5120_4_ +
               fVar56 * (float)bezier_basis0._6276_4_ +
               fVar95 * (float)bezier_basis0._8588_4_ + fVar34 * (float)bezier_basis0._7432_4_;
          auVar88._24_4_ =
               fVar90 * (float)bezier_basis0._5124_4_ +
               fVar89 * (float)bezier_basis0._6280_4_ +
               fVar96 * (float)bezier_basis0._8592_4_ + fVar53 * (float)bezier_basis0._7436_4_;
          auVar88._28_4_ = fVar92 + fVar91 + fVar113 + fVar54;
          auVar50 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,1);
          auVar20._4_4_ = auVar50._4_4_ * 0.055555556;
          auVar20._0_4_ = auVar50._0_4_ * 0.055555556;
          auVar20._8_4_ = auVar50._8_4_ * 0.055555556;
          auVar20._12_4_ = auVar50._12_4_ * 0.055555556;
          auVar20._16_4_ = auVar50._16_4_ * 0.055555556;
          auVar20._20_4_ = auVar50._20_4_ * 0.055555556;
          auVar20._24_4_ = auVar50._24_4_ * 0.055555556;
          auVar20._28_4_ = auVar50._28_4_;
          auVar20 = vsubps_avx(auVar112,auVar20);
          auVar50 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
          auVar165._0_4_ = auVar112._0_4_ + auVar50._0_4_ * 0.055555556;
          auVar165._4_4_ = auVar112._4_4_ + auVar50._4_4_ * 0.055555556;
          auVar165._8_4_ = auVar112._8_4_ + auVar50._8_4_ * 0.055555556;
          auVar165._12_4_ = auVar112._12_4_ + auVar50._12_4_ * 0.055555556;
          auVar165._16_4_ = auVar112._16_4_ + auVar50._16_4_ * 0.055555556;
          auVar165._20_4_ = auVar112._20_4_ + auVar50._20_4_ * 0.055555556;
          auVar165._24_4_ = auVar112._24_4_ + auVar50._24_4_ * 0.055555556;
          auVar165._28_4_ = auVar50._28_4_ + 0.0;
          auVar52._8_4_ = 0xff800000;
          auVar52._0_8_ = 0xff800000ff800000;
          auVar52._12_4_ = 0xff800000;
          auVar52._16_4_ = 0xff800000;
          auVar52._20_4_ = 0xff800000;
          auVar52._24_4_ = 0xff800000;
          auVar52._28_4_ = 0xff800000;
          auVar50 = vmaxps_avx(auVar52,auVar112);
          auVar17 = vmaxps_avx(auVar20,auVar165);
          auVar50 = vmaxps_avx(auVar50,auVar17);
          auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
          auVar50 = vmaxps_avx(auVar50,auVar17);
          auVar17 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vmaxps_avx(auVar50,auVar17);
          auVar39 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar39 = vinsertps_avx(auVar42,auVar39,0x28);
          auVar50 = vminps_avx(auVar51,auVar139);
          auVar173._8_4_ = 0x7f800000;
          auVar173._0_8_ = 0x7f8000007f800000;
          auVar173._12_4_ = 0x7f800000;
          auVar173._16_4_ = 0x7f800000;
          auVar173._20_4_ = 0x7f800000;
          auVar173._24_4_ = 0x7f800000;
          auVar173._28_4_ = 0x7f800000;
          auVar17 = vminps_avx(auVar173,auVar199);
          auVar50 = vminps_avx(auVar17,auVar50);
          auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
          auVar50 = vminps_avx(auVar50,auVar17);
          auVar17 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vminps_avx(auVar50,auVar17);
          auVar42 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar50 = vminps_avx(auVar19,auVar132);
          auVar17 = vminps_avx(auVar173,auVar146);
          auVar50 = vminps_avx(auVar17,auVar50);
          auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
          auVar50 = vminps_avx(auVar50,auVar17);
          auVar17 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vminps_avx(auVar50,auVar17);
          auVar41 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar41 = vunpcklps_avx(auVar42,auVar41);
          auVar50 = vminps_avx(auVar20,auVar165);
          auVar166 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar156 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          auVar17 = vminps_avx(auVar173,auVar112);
          auVar50 = vminps_avx(auVar17,auVar50);
          auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
          auVar50 = vminps_avx(auVar50,auVar17);
          auVar17 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vminps_avx(auVar50,auVar17);
          auVar42 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar42 = vinsertps_avx(auVar41,auVar42,0x28);
          auVar50 = vshufps_avx(auVar110,auVar110,0xb1);
          auVar50 = vminps_avx(auVar110,auVar50);
          auVar17 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vminps_avx(auVar50,auVar17);
          auVar41 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar50 = vshufps_avx(auVar18,auVar18,0xb1);
          auVar50 = vminps_avx(auVar18,auVar50);
          auVar17 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vminps_avx(auVar50,auVar17);
          auVar70 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar70 = vunpcklps_avx(auVar41,auVar70);
          auVar50 = vshufps_avx(auVar16,auVar16,0xb1);
          auVar50 = vminps_avx(auVar16,auVar50);
          auVar17 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vminps_avx(auVar50,auVar17);
          auVar41 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar41 = vinsertps_avx(auVar70,auVar41,0x28);
          auVar70 = vminps_avx(auVar42,auVar41);
          auVar50 = vshufps_avx(auVar15,auVar15,0xb1);
          auVar50 = vmaxps_avx(auVar15,auVar50);
          auVar15 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vmaxps_avx(auVar50,auVar15);
          auVar42 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar50 = vshufps_avx(auVar49,auVar49,0xb1);
          auVar50 = vmaxps_avx(auVar49,auVar50);
          auVar15 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vmaxps_avx(auVar50,auVar15);
          auVar41 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar41 = vunpcklps_avx(auVar42,auVar41);
          auVar50 = vshufps_avx(auVar14,auVar14,0xb1);
          auVar50 = vmaxps_avx(auVar14,auVar50);
          auVar14 = vshufpd_avx(auVar50,auVar50,5);
          auVar50 = vmaxps_avx(auVar50,auVar14);
          auVar42 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
          auVar42 = vinsertps_avx(auVar41,auVar42,0x28);
          auVar41 = vmaxps_avx(auVar39,auVar42);
          auVar125._8_4_ = 0x7fffffff;
          auVar125._0_8_ = 0x7fffffff7fffffff;
          auVar125._12_4_ = 0x7fffffff;
          auVar39 = vandps_avx(auVar70,auVar125);
          auVar42 = vandps_avx(auVar41,auVar125);
          auVar39 = vmaxps_avx(auVar39,auVar42);
          auVar42 = vmovshdup_avx(auVar39);
          auVar42 = vmaxss_avx(auVar42,auVar39);
          auVar39 = vshufpd_avx(auVar39,auVar39,1);
          auVar39 = vmaxss_avx(auVar39,auVar42);
          auVar39 = ZEXT416((uint)(auVar39._0_4_ * 4.7683716e-07));
          auVar39 = vshufps_avx(auVar39,auVar39,0);
          auVar42 = vsubps_avx(auVar70,auVar39);
          aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar42,ZEXT416(geomID),0x30);
          auVar79._0_4_ = auVar41._0_4_ + auVar39._0_4_;
          auVar79._4_4_ = auVar41._4_4_ + auVar39._4_4_;
          auVar79._8_4_ = auVar41._8_4_ + auVar39._8_4_;
          auVar79._12_4_ = auVar41._12_4_ + auVar39._12_4_;
          aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar79,ZEXT416((uint)uVar30),0x30);
          auVar106._0_4_ = aVar12.x + aVar13.x;
          auVar106._4_4_ = aVar12.y + aVar13.y;
          auVar106._8_4_ = aVar12.z + aVar13.z;
          auVar106._12_4_ = aVar12.field_3.w + aVar13.field_3.w;
          local_168 = vminps_avx(local_168,auVar106);
          local_158 = vmaxps_avx(local_158,auVar106);
          local_178 = vmaxps_avx(local_178,(undefined1  [16])aVar13);
          prims[local_330].upper.field_0.field_1 = aVar13;
          local_188 = vminps_avx(local_188,(undefined1  [16])aVar12);
          prims[local_330].lower.field_0.field_1 = aVar12;
          local_338 = local_338 + 1;
          local_330 = local_330 + 1;
          break;
        }
        lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar29);
        lVar9 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar29);
        auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar8 + 0xc + lVar9 * uVar28)),
                                ZEXT416(*(uint *)(lVar8 + 0xc + lVar9 * uVar33)),0x10);
        auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar8 + 0xc + lVar9 * uVar32)),0x20);
        auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar8 + 0xc + lVar9 * uVar31)),0x30);
        auVar59._8_4_ = 0x7fffffff;
        auVar59._0_8_ = 0x7fffffff7fffffff;
        auVar59._12_4_ = 0x7fffffff;
        auVar39 = vandps_avx(auVar39,auVar59);
        auVar42 = auVar156._0_16_;
        auVar39 = vcmpps_avx(auVar39,auVar42,5);
        if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar39[0xf] < '\0') break;
        auVar39 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar28);
        auVar73 = auVar166._0_16_;
        auVar41 = vcmpps_avx(auVar39,auVar73,6);
        auVar70 = vcmpps_avx(auVar39,auVar42,1);
        auVar41 = vandps_avx(auVar41,auVar70);
        uVar27 = vmovmskps_avx(auVar41);
        if ((~(byte)uVar27 & 7) != 0) break;
        auVar41 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar33);
        auVar70 = vcmpps_avx(auVar41,auVar73,6);
        auVar71 = vcmpps_avx(auVar41,auVar42,1);
        auVar70 = vandps_avx(auVar70,auVar71);
        uVar27 = vmovmskps_avx(auVar70);
        if ((~(byte)uVar27 & 7) != 0) break;
        auVar70 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar32);
        auVar71 = vcmpps_avx(auVar70,auVar73,6);
        auVar44 = vcmpps_avx(auVar70,auVar42,1);
        auVar71 = vandps_avx(auVar71,auVar44);
        uVar27 = vmovmskps_avx(auVar71);
        if ((~(byte)uVar27 & 7) != 0) break;
        auVar71 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar31);
        auVar44 = vcmpps_avx(auVar71,auVar73,6);
        auVar78 = vcmpps_avx(auVar71,auVar42,1);
        auVar44 = vandps_avx(auVar44,auVar78);
        uVar27 = vmovmskps_avx(auVar44);
        if ((~(byte)uVar27 & 7) != 0) break;
        lVar8 = *(long *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar29);
        lVar9 = *(long *)((long)&(pBVar7->super_RawBufferView).stride + lVar29);
        auVar44 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar28);
        auVar78 = vcmpps_avx(auVar44,auVar73,6);
        auVar67 = vcmpps_avx(auVar44,auVar42,1);
        auVar78 = vandps_avx(auVar78,auVar67);
        uVar27 = vmovmskps_avx(auVar78);
        if ((~(byte)uVar27 & 7) != 0) break;
        auVar78 = *(undefined1 (*) [16])(lVar8 + lVar9 * uVar33);
        auVar73 = vcmpps_avx(auVar78,auVar73,6);
        auVar42 = vcmpps_avx(auVar78,auVar42,1);
        auVar42 = vandps_avx(auVar73,auVar42);
        uVar27 = vmovmskps_avx(auVar42);
        if ((~(byte)uVar27 & 7) != 0) break;
        auVar42 = vshufps_avx(auVar39,auVar39,0xff);
        auVar39 = vinsertps_avx(auVar39,ZEXT416((uint)(auVar42._0_4_ * fVar58)),0x30);
        auVar42 = vshufps_avx(auVar41,auVar41,0xff);
        auVar42 = vinsertps_avx(auVar41,ZEXT416((uint)(auVar42._0_4_ * fVar58)),0x30);
        auVar41 = vshufps_avx(auVar70,auVar70,0xff);
        auVar41 = vinsertps_avx(auVar70,ZEXT416((uint)(auVar41._0_4_ * fVar58)),0x30);
        fVar95 = auVar41._0_4_ * 0.0;
        fVar113 = auVar41._4_4_ * 0.0;
        fVar116 = auVar41._8_4_ * 0.0;
        fVar119 = auVar41._12_4_ * 0.0;
        auVar70 = vshufps_avx(auVar71,auVar71,0xff);
        auVar70 = vinsertps_avx(auVar71,ZEXT416((uint)(auVar70._0_4_ * fVar58)),0x30);
        fVar122 = auVar70._0_4_;
        fVar133 = auVar70._4_4_;
        fVar134 = auVar70._8_4_;
        fVar135 = auVar70._12_4_;
        fVar157 = fVar95 + fVar122 * 0.0;
        fVar167 = fVar113 + fVar133 * 0.0;
        fVar168 = fVar116 + fVar134 * 0.0;
        fVar169 = fVar119 + fVar135 * 0.0;
        fVar34 = auVar78._0_4_ * 0.0;
        fVar53 = auVar78._4_4_ * 0.0;
        fVar54 = auVar78._8_4_ * 0.0;
        fVar55 = auVar78._12_4_ * 0.0;
        pauVar1 = (undefined1 (*) [16])(lVar8 + lVar9 * uVar32);
        auVar68 = *pauVar1;
        fVar96 = *(float *)*pauVar1 * 0.0;
        fVar114 = *(float *)(*pauVar1 + 4) * 0.0;
        fVar117 = *(float *)(*pauVar1 + 8) * 0.0;
        fVar120 = *(float *)(*pauVar1 + 0xc) * 0.0;
        pauVar1 = (undefined1 (*) [16])(lVar8 + lVar9 * uVar31);
        auVar43 = *pauVar1;
        fVar56 = fVar96 + *(float *)*pauVar1 * 0.0;
        fVar89 = fVar114 + *(float *)(*pauVar1 + 4) * 0.0;
        fVar91 = fVar117 + *(float *)(*pauVar1 + 8) * 0.0;
        fVar93 = fVar120 + *(float *)(*pauVar1 + 0xc) * 0.0;
        fVar196 = auVar44._0_4_;
        auVar98._0_4_ = fVar196 + fVar34 + fVar56;
        fVar200 = auVar44._4_4_;
        auVar98._4_4_ = fVar200 + fVar53 + fVar89;
        fVar201 = auVar44._8_4_;
        auVar98._8_4_ = fVar201 + fVar54 + fVar91;
        fVar202 = auVar44._12_4_;
        auVar98._12_4_ = fVar202 + fVar55 + fVar93;
        auVar136._0_4_ = fVar157 + auVar42._0_4_ * 3.0;
        auVar136._4_4_ = fVar167 + auVar42._4_4_ * 3.0;
        auVar136._8_4_ = fVar168 + auVar42._8_4_ * 3.0;
        auVar136._12_4_ = fVar169 + auVar42._12_4_ * 3.0;
        fVar174 = auVar39._0_4_;
        auVar182._0_4_ = fVar174 * 3.0;
        fVar178 = auVar39._4_4_;
        auVar182._4_4_ = fVar178 * 3.0;
        fVar179 = auVar39._8_4_;
        auVar182._8_4_ = fVar179 * 3.0;
        fVar180 = auVar39._12_4_;
        auVar182._12_4_ = fVar180 * 3.0;
        auVar67 = vsubps_avx(auVar136,auVar182);
        auVar73 = vshufps_avx(auVar67,auVar67,0xc9);
        auVar137._0_4_ = auVar98._0_4_ * auVar73._0_4_;
        auVar137._4_4_ = auVar98._4_4_ * auVar73._4_4_;
        auVar137._8_4_ = auVar98._8_4_ * auVar73._8_4_;
        auVar137._12_4_ = auVar98._12_4_ * auVar73._12_4_;
        auVar39 = vshufps_avx(auVar98,auVar98,0xc9);
        fVar97 = auVar67._0_4_;
        auVar99._0_4_ = fVar97 * auVar39._0_4_;
        fVar115 = auVar67._4_4_;
        auVar99._4_4_ = fVar115 * auVar39._4_4_;
        fVar118 = auVar67._8_4_;
        auVar99._8_4_ = fVar118 * auVar39._8_4_;
        fVar121 = auVar67._12_4_;
        auVar99._12_4_ = fVar121 * auVar39._12_4_;
        auVar39 = vsubps_avx(auVar137,auVar99);
        auVar71 = vshufps_avx(auVar39,auVar39,0xc9);
        auVar39 = vdpps_avx(auVar71,auVar71,0x7f);
        fVar181 = auVar39._0_4_;
        auVar100._4_8_ = SUB128(ZEXT812(0),4);
        auVar100._0_4_ = fVar181;
        auVar100._12_4_ = 0;
        auVar70 = vrsqrtss_avx(auVar100,auVar100);
        fVar186 = auVar70._0_4_;
        auVar60._0_4_ = auVar78._0_4_ * 3.0 + fVar56;
        auVar60._4_4_ = auVar78._4_4_ * 3.0 + fVar89;
        auVar60._8_4_ = auVar78._8_4_ * 3.0 + fVar91;
        auVar60._12_4_ = auVar78._12_4_ * 3.0 + fVar93;
        auVar151._0_4_ = fVar196 * 3.0;
        auVar151._4_4_ = fVar200 * 3.0;
        auVar151._8_4_ = fVar201 * 3.0;
        auVar151._12_4_ = fVar202 * 3.0;
        auVar70 = vsubps_avx(auVar60,auVar151);
        auVar35._0_4_ = auVar70._0_4_ * auVar73._0_4_;
        auVar35._4_4_ = auVar70._4_4_ * auVar73._4_4_;
        auVar35._8_4_ = auVar70._8_4_ * auVar73._8_4_;
        auVar35._12_4_ = auVar70._12_4_ * auVar73._12_4_;
        auVar70 = vshufps_avx(auVar70,auVar70,0xc9);
        auVar61._0_4_ = fVar97 * auVar70._0_4_;
        auVar61._4_4_ = fVar115 * auVar70._4_4_;
        auVar61._8_4_ = fVar118 * auVar70._8_4_;
        auVar61._12_4_ = fVar121 * auVar70._12_4_;
        auVar70 = vsubps_avx(auVar35,auVar61);
        auVar70 = vshufps_avx(auVar70,auVar70,0xc9);
        auVar73 = vshufps_avx(auVar39,auVar39,0);
        auVar39 = vdpps_avx(auVar71,auVar70,0x7f);
        auVar36._0_4_ = auVar73._0_4_ * auVar70._0_4_;
        auVar36._4_4_ = auVar73._4_4_ * auVar70._4_4_;
        auVar36._8_4_ = auVar73._8_4_ * auVar70._8_4_;
        auVar36._12_4_ = auVar73._12_4_ * auVar70._12_4_;
        auVar39 = vshufps_avx(auVar39,auVar39,0);
        auVar62._0_4_ = auVar39._0_4_ * auVar71._0_4_;
        auVar62._4_4_ = auVar39._4_4_ * auVar71._4_4_;
        auVar62._8_4_ = auVar39._8_4_ * auVar71._8_4_;
        auVar62._12_4_ = auVar39._12_4_ * auVar71._12_4_;
        auVar44 = vsubps_avx(auVar36,auVar62);
        auVar39 = vrcpss_avx(auVar100,auVar100);
        fVar57 = auVar42._0_4_ * 0.0;
        fVar90 = auVar42._4_4_ * 0.0;
        fVar92 = auVar42._8_4_ * 0.0;
        fVar94 = auVar42._12_4_ * 0.0;
        auVar183._0_4_ = fVar174 + fVar157 + fVar57;
        auVar183._4_4_ = fVar178 + fVar167 + fVar90;
        auVar183._8_4_ = fVar179 + fVar168 + fVar92;
        auVar183._12_4_ = fVar180 + fVar169 + fVar94;
        auVar39 = ZEXT416((uint)(auVar39._0_4_ * (2.0 - fVar181 * auVar39._0_4_)));
        auVar39 = vshufps_avx(auVar39,auVar39,0);
        auVar42 = vshufps_avx(auVar183,auVar183,0xff);
        auVar70 = ZEXT416((uint)(fVar186 * 1.5 - fVar186 * fVar186 * fVar186 * fVar181 * 0.5));
        auVar70 = vshufps_avx(auVar70,auVar70,0);
        fVar56 = auVar71._0_4_ * auVar70._0_4_;
        fVar89 = auVar71._4_4_ * auVar70._4_4_;
        fVar91 = auVar71._8_4_ * auVar70._8_4_;
        fVar93 = auVar71._12_4_ * auVar70._12_4_;
        auVar73 = vshufps_avx(auVar67,auVar67,0xff);
        local_2c8._0_4_ = auVar42._0_4_ * fVar56;
        local_2c8._4_4_ = auVar42._4_4_ * fVar89;
        fStack_2c0 = auVar42._8_4_ * fVar91;
        fStack_2bc = auVar42._12_4_ * fVar93;
        local_138._0_4_ =
             auVar73._0_4_ * fVar56 + auVar42._0_4_ * auVar70._0_4_ * auVar44._0_4_ * auVar39._0_4_;
        local_138._4_4_ =
             auVar73._4_4_ * fVar89 + auVar42._4_4_ * auVar70._4_4_ * auVar44._4_4_ * auVar39._4_4_;
        fStack_130 = auVar73._8_4_ * fVar91 +
                     auVar42._8_4_ * auVar70._8_4_ * auVar44._8_4_ * auVar39._8_4_;
        fStack_12c = auVar73._12_4_ * fVar93 +
                     auVar42._12_4_ * auVar70._12_4_ * auVar44._12_4_ * auVar39._12_4_;
        auVar123._0_4_ = fVar174 * 0.0;
        auVar123._4_4_ = fVar178 * 0.0;
        auVar123._8_4_ = fVar179 * 0.0;
        auVar123._12_4_ = fVar180 * 0.0;
        auVar192._0_4_ = fVar196 * 0.0;
        auVar192._4_4_ = fVar200 * 0.0;
        auVar192._8_4_ = fVar201 * 0.0;
        auVar192._12_4_ = fVar202 * 0.0;
        local_268 = auVar43._0_4_;
        fStack_264 = auVar43._4_4_;
        fStack_260 = auVar43._8_4_;
        fStack_25c = auVar43._12_4_;
        auVar37._0_4_ = auVar192._0_4_ + fVar34 + local_268 + fVar96;
        auVar37._4_4_ = auVar192._4_4_ + fVar53 + fStack_264 + fVar114;
        auVar37._8_4_ = auVar192._8_4_ + fVar54 + fStack_260 + fVar117;
        auVar37._12_4_ = auVar192._12_4_ + fVar55 + fStack_25c + fVar120;
        auVar138._0_4_ = fVar122 * 3.0;
        auVar138._4_4_ = fVar133 * 3.0;
        auVar138._8_4_ = fVar134 * 3.0;
        auVar138._12_4_ = fVar135 * 3.0;
        auVar147._0_4_ = auVar41._0_4_ * 3.0;
        auVar147._4_4_ = auVar41._4_4_ * 3.0;
        auVar147._8_4_ = auVar41._8_4_ * 3.0;
        auVar147._12_4_ = auVar41._12_4_ * 3.0;
        auVar39 = vsubps_avx(auVar138,auVar147);
        auVar63._0_4_ = fVar57 + auVar39._0_4_;
        auVar63._4_4_ = fVar90 + auVar39._4_4_;
        auVar63._8_4_ = fVar92 + auVar39._8_4_;
        auVar63._12_4_ = fVar94 + auVar39._12_4_;
        auVar78 = vsubps_avx(auVar63,auVar123);
        auVar70 = vshufps_avx(auVar78,auVar78,0xc9);
        auVar64._0_4_ = auVar70._0_4_ * auVar37._0_4_;
        auVar64._4_4_ = auVar70._4_4_ * auVar37._4_4_;
        auVar64._8_4_ = auVar70._8_4_ * auVar37._8_4_;
        auVar64._12_4_ = auVar70._12_4_ * auVar37._12_4_;
        auVar39 = vshufps_avx(auVar37,auVar37,0xc9);
        fVar56 = auVar78._0_4_;
        auVar38._0_4_ = auVar39._0_4_ * fVar56;
        fVar89 = auVar78._4_4_;
        auVar38._4_4_ = auVar39._4_4_ * fVar89;
        fVar91 = auVar78._8_4_;
        auVar38._8_4_ = auVar39._8_4_ * fVar91;
        fVar93 = auVar78._12_4_;
        auVar38._12_4_ = auVar39._12_4_ * fVar93;
        auVar39 = vsubps_avx(auVar64,auVar38);
        auVar73 = vshufps_avx(auVar39,auVar39,0xc9);
        auVar42 = vdpps_avx(auVar73,auVar73,0x7f);
        auVar197._0_4_ = auVar123._0_4_ + fVar57 + fVar122 + fVar95;
        auVar197._4_4_ = auVar123._4_4_ + fVar90 + fVar133 + fVar113;
        auVar197._8_4_ = auVar123._8_4_ + fVar92 + fVar134 + fVar116;
        auVar197._12_4_ = auVar123._12_4_ + fVar94 + fVar135 + fVar119;
        auVar39 = vblendps_avx(auVar42,_DAT_01f45a50,0xe);
        auVar41 = vrsqrtss_avx(auVar39,auVar39);
        fVar57 = auVar41._0_4_;
        auVar140._0_4_ = auVar183._0_4_ + (float)local_2c8._0_4_;
        auVar140._4_4_ = auVar183._4_4_ + (float)local_2c8._4_4_;
        auVar140._8_4_ = auVar183._8_4_ + fStack_2c0;
        auVar140._12_4_ = auVar183._12_4_ + fStack_2bc;
        auVar148._0_4_ = local_268 * 3.0;
        auVar148._4_4_ = fStack_264 * 3.0;
        auVar148._8_4_ = fStack_260 * 3.0;
        auVar148._12_4_ = fStack_25c * 3.0;
        local_d8 = auVar68._0_4_;
        fStack_d4 = auVar68._4_4_;
        fStack_d0 = auVar68._8_4_;
        fStack_cc = auVar68._12_4_;
        auVar170._0_4_ = local_d8 * 3.0;
        auVar170._4_4_ = fStack_d4 * 3.0;
        auVar170._8_4_ = fStack_d0 * 3.0;
        auVar170._12_4_ = fStack_cc * 3.0;
        auVar41 = vsubps_avx(auVar148,auVar170);
        auVar187._0_4_ = auVar140._0_4_ + (fVar97 + (float)local_138._0_4_) * 0.33333334;
        auVar187._4_4_ = auVar140._4_4_ + (fVar115 + (float)local_138._4_4_) * 0.33333334;
        auVar187._8_4_ = auVar140._8_4_ + (fVar118 + fStack_130) * 0.33333334;
        auVar187._12_4_ = auVar140._12_4_ + (fVar121 + fStack_12c) * 0.33333334;
        auVar171._0_4_ = fVar34 + auVar41._0_4_;
        auVar171._4_4_ = fVar53 + auVar41._4_4_;
        auVar171._8_4_ = fVar54 + auVar41._8_4_;
        auVar171._12_4_ = fVar55 + auVar41._12_4_;
        auVar71 = vshufps_avx(auVar197,auVar197,0xff);
        auVar41 = ZEXT416((uint)(fVar57 * 1.5 - auVar42._0_4_ * 0.5 * fVar57 * fVar57 * fVar57));
        auVar44 = vshufps_avx(auVar41,auVar41,0);
        auVar41 = vsubps_avx(auVar171,auVar192);
        fVar34 = auVar73._0_4_ * auVar44._0_4_;
        fVar53 = auVar73._4_4_ * auVar44._4_4_;
        fVar54 = auVar73._8_4_ * auVar44._8_4_;
        fVar55 = auVar73._12_4_ * auVar44._12_4_;
        auVar158._0_4_ = auVar70._0_4_ * auVar41._0_4_;
        auVar158._4_4_ = auVar70._4_4_ * auVar41._4_4_;
        auVar158._8_4_ = auVar70._8_4_ * auVar41._8_4_;
        auVar158._12_4_ = auVar70._12_4_ * auVar41._12_4_;
        auVar41 = vshufps_avx(auVar41,auVar41,0xc9);
        auVar101._0_4_ = fVar56 * auVar41._0_4_;
        auVar101._4_4_ = fVar89 * auVar41._4_4_;
        auVar101._8_4_ = fVar91 * auVar41._8_4_;
        auVar101._12_4_ = fVar93 * auVar41._12_4_;
        auVar70 = vsubps_avx(auVar158,auVar101);
        auVar41 = vshufps_avx(auVar42,auVar42,0);
        auVar70 = vshufps_avx(auVar70,auVar70,0xc9);
        auVar159._0_4_ = auVar41._0_4_ * auVar70._0_4_;
        auVar159._4_4_ = auVar41._4_4_ * auVar70._4_4_;
        auVar159._8_4_ = auVar41._8_4_ * auVar70._8_4_;
        auVar159._12_4_ = auVar41._12_4_ * auVar70._12_4_;
        auVar41 = vdpps_avx(auVar73,auVar70,0x7f);
        auVar41 = vshufps_avx(auVar41,auVar41,0);
        auVar102._0_4_ = auVar41._0_4_ * auVar73._0_4_;
        auVar102._4_4_ = auVar41._4_4_ * auVar73._4_4_;
        auVar102._8_4_ = auVar41._8_4_ * auVar73._8_4_;
        auVar102._12_4_ = auVar41._12_4_ * auVar73._12_4_;
        auVar41 = vshufps_avx(auVar78,auVar78,0xff);
        local_358._0_4_ = auVar71._0_4_ * fVar34;
        local_358._4_4_ = auVar71._4_4_ * fVar53;
        fStack_350 = auVar71._8_4_ * fVar54;
        fStack_34c = auVar71._12_4_ * fVar55;
        auVar70 = vsubps_avx(auVar159,auVar102);
        auVar193._0_4_ = auVar197._0_4_ + (float)local_358._0_4_;
        auVar193._4_4_ = auVar197._4_4_ + (float)local_358._4_4_;
        auVar193._8_4_ = auVar197._8_4_ + fStack_350;
        auVar193._12_4_ = auVar197._12_4_ + fStack_34c;
        auVar39 = vrcpss_avx(auVar39,auVar39);
        auVar39 = ZEXT416((uint)(auVar39._0_4_ * (2.0 - auVar42._0_4_ * auVar39._0_4_)));
        auVar39 = vshufps_avx(auVar39,auVar39,0);
        fVar57 = fVar34 * auVar41._0_4_ +
                 auVar71._0_4_ * auVar44._0_4_ * auVar70._0_4_ * auVar39._0_4_;
        fVar90 = fVar53 * auVar41._4_4_ +
                 auVar71._4_4_ * auVar44._4_4_ * auVar70._4_4_ * auVar39._4_4_;
        fVar92 = fVar54 * auVar41._8_4_ +
                 auVar71._8_4_ * auVar44._8_4_ * auVar70._8_4_ * auVar39._8_4_;
        fVar94 = fVar55 * auVar41._12_4_ +
                 auVar71._12_4_ * auVar44._12_4_ * auVar70._12_4_ * auVar39._12_4_;
        auVar40._0_4_ = (fVar56 + fVar57) * 0.33333334;
        auVar40._4_4_ = (fVar89 + fVar90) * 0.33333334;
        auVar40._8_4_ = (fVar91 + fVar92) * 0.33333334;
        auVar40._12_4_ = (fVar93 + fVar94) * 0.33333334;
        auVar41 = vsubps_avx(auVar193,auVar40);
        auVar39 = vshufps_avx(auVar41,auVar41,0xaa);
        fVar56 = auVar39._0_4_;
        fVar89 = auVar39._4_4_;
        fVar91 = auVar39._8_4_;
        fVar93 = auVar39._12_4_;
        auVar39 = vshufps_avx(auVar193,auVar193,0xaa);
        fVar34 = auVar39._0_4_;
        fVar53 = auVar39._4_4_;
        fVar54 = auVar39._8_4_;
        fVar55 = auVar39._12_4_;
        auVar39 = vshufps_avx(auVar187,auVar187,0xaa);
        fVar95 = auVar39._0_4_;
        fVar96 = auVar39._4_4_;
        fVar113 = auVar39._8_4_;
        auVar42 = vshufps_avx(auVar140,auVar140,0xaa);
        fVar114 = auVar42._0_4_;
        fVar116 = auVar42._4_4_;
        fVar117 = auVar42._8_4_;
        auVar150._0_4_ =
             fVar114 * (float)bezier_basis0._476_4_ +
             fVar95 * (float)bezier_basis0._1632_4_ +
             fVar56 * (float)bezier_basis0._2788_4_ + fVar34 * (float)bezier_basis0._3944_4_;
        auVar150._4_4_ =
             fVar116 * (float)bezier_basis0._480_4_ +
             fVar96 * (float)bezier_basis0._1636_4_ +
             fVar89 * (float)bezier_basis0._2792_4_ + fVar53 * (float)bezier_basis0._3948_4_;
        auVar150._8_4_ =
             fVar117 * (float)bezier_basis0._484_4_ +
             fVar113 * (float)bezier_basis0._1640_4_ +
             fVar91 * (float)bezier_basis0._2796_4_ + fVar54 * (float)bezier_basis0._3952_4_;
        auVar150._12_4_ =
             auVar42._12_4_ * (float)bezier_basis0._488_4_ +
             auVar39._12_4_ * (float)bezier_basis0._1644_4_ +
             fVar93 * (float)bezier_basis0._2800_4_ + fVar55 * (float)bezier_basis0._3956_4_;
        auVar150._16_4_ =
             fVar114 * (float)bezier_basis0._492_4_ +
             fVar95 * (float)bezier_basis0._1648_4_ +
             fVar56 * (float)bezier_basis0._2804_4_ + fVar34 * (float)bezier_basis0._3960_4_;
        auVar150._20_4_ =
             fVar116 * (float)bezier_basis0._496_4_ +
             fVar96 * (float)bezier_basis0._1652_4_ +
             fVar89 * (float)bezier_basis0._2808_4_ + fVar53 * (float)bezier_basis0._3964_4_;
        auVar150._24_4_ =
             fVar117 * (float)bezier_basis0._500_4_ +
             fVar113 * (float)bezier_basis0._1656_4_ +
             fVar91 * (float)bezier_basis0._2812_4_ + fVar54 * (float)bezier_basis0._3968_4_;
        auVar150._28_4_ = 0;
        auVar80._8_4_ = 0xff800000;
        auVar80._0_8_ = 0xff800000ff800000;
        auVar80._12_4_ = 0xff800000;
        auVar80._16_4_ = 0xff800000;
        auVar80._20_4_ = 0xff800000;
        auVar80._24_4_ = 0xff800000;
        auVar80._28_4_ = 0xff800000;
        auVar14 = vmaxps_avx(auVar80,auVar150);
        auVar45._0_4_ =
             fVar114 * (float)bezier_basis0._5100_4_ +
             fVar95 * (float)bezier_basis0._6256_4_ +
             fVar56 * (float)bezier_basis0._7412_4_ + fVar34 * (float)bezier_basis0._8568_4_;
        auVar45._4_4_ =
             fVar116 * (float)bezier_basis0._5104_4_ +
             fVar96 * (float)bezier_basis0._6260_4_ +
             fVar89 * (float)bezier_basis0._7416_4_ + fVar53 * (float)bezier_basis0._8572_4_;
        auVar45._8_4_ =
             fVar117 * (float)bezier_basis0._5108_4_ +
             fVar113 * (float)bezier_basis0._6264_4_ +
             fVar91 * (float)bezier_basis0._7420_4_ + fVar54 * (float)bezier_basis0._8576_4_;
        auVar45._12_4_ =
             auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
             auVar39._12_4_ * (float)bezier_basis0._6268_4_ +
             fVar93 * (float)bezier_basis0._7424_4_ + fVar55 * (float)bezier_basis0._8580_4_;
        auVar45._16_4_ =
             fVar114 * (float)bezier_basis0._5116_4_ +
             fVar95 * (float)bezier_basis0._6272_4_ +
             fVar56 * (float)bezier_basis0._7428_4_ + fVar34 * (float)bezier_basis0._8584_4_;
        auVar45._20_4_ =
             fVar116 * (float)bezier_basis0._5120_4_ +
             fVar96 * (float)bezier_basis0._6276_4_ +
             fVar89 * (float)bezier_basis0._7432_4_ + fVar53 * (float)bezier_basis0._8588_4_;
        auVar45._24_4_ =
             fVar117 * (float)bezier_basis0._5124_4_ +
             fVar113 * (float)bezier_basis0._6280_4_ +
             fVar91 * (float)bezier_basis0._7436_4_ + fVar54 * (float)bezier_basis0._8592_4_;
        auVar45._28_4_ = fVar55 + fVar93 + 0.0 + 0.0;
        auVar50 = vblendps_avx(auVar45,ZEXT432(0) << 0x20,1);
        auVar18._4_4_ = auVar50._4_4_ * 0.055555556;
        auVar18._0_4_ = auVar50._0_4_ * 0.055555556;
        auVar18._8_4_ = auVar50._8_4_ * 0.055555556;
        auVar18._12_4_ = auVar50._12_4_ * 0.055555556;
        auVar18._16_4_ = auVar50._16_4_ * 0.055555556;
        auVar18._20_4_ = auVar50._20_4_ * 0.055555556;
        auVar18._24_4_ = auVar50._24_4_ * 0.055555556;
        auVar18._28_4_ = auVar50._28_4_;
        auVar17 = vsubps_avx(auVar150,auVar18);
        auVar50 = vblendps_avx(auVar45,ZEXT432(0) << 0x20,0x80);
        auVar46._0_4_ = auVar150._0_4_ + auVar50._0_4_ * 0.055555556;
        auVar46._4_4_ = auVar150._4_4_ + auVar50._4_4_ * 0.055555556;
        auVar46._8_4_ = auVar150._8_4_ + auVar50._8_4_ * 0.055555556;
        auVar46._12_4_ = auVar150._12_4_ + auVar50._12_4_ * 0.055555556;
        auVar46._16_4_ = auVar150._16_4_ + auVar50._16_4_ * 0.055555556;
        auVar46._20_4_ = auVar150._20_4_ + auVar50._20_4_ * 0.055555556;
        auVar46._24_4_ = auVar150._24_4_ + auVar50._24_4_ * 0.055555556;
        auVar46._28_4_ = auVar50._28_4_ + 0.0;
        auVar50 = vmaxps_avx(auVar17,auVar46);
        auVar14 = vmaxps_avx(auVar14,auVar50);
        auVar39 = vshufps_avx(auVar41,auVar41,0x55);
        auVar42 = vshufps_avx(auVar193,auVar193,0x55);
        fVar56 = auVar39._0_4_;
        fVar91 = auVar39._4_4_;
        fVar34 = auVar39._8_4_;
        fVar54 = auVar39._12_4_;
        fVar89 = auVar42._0_4_;
        fVar93 = auVar42._4_4_;
        fVar53 = auVar42._8_4_;
        fVar55 = auVar42._12_4_;
        auVar39 = vshufps_avx(auVar187,auVar187,0x55);
        fVar114 = auVar39._0_4_;
        fVar116 = auVar39._4_4_;
        fVar117 = auVar39._8_4_;
        auVar42 = vshufps_avx(auVar140,auVar140,0x55);
        fVar95 = auVar42._0_4_;
        fVar96 = auVar42._4_4_;
        fVar113 = auVar42._8_4_;
        auVar191._0_4_ =
             fVar95 * (float)bezier_basis0._476_4_ +
             fVar114 * (float)bezier_basis0._1632_4_ +
             (float)bezier_basis0._3944_4_ * fVar89 + (float)bezier_basis0._2788_4_ * fVar56;
        auVar191._4_4_ =
             fVar96 * (float)bezier_basis0._480_4_ +
             fVar116 * (float)bezier_basis0._1636_4_ +
             (float)bezier_basis0._3948_4_ * fVar93 + (float)bezier_basis0._2792_4_ * fVar91;
        auVar191._8_4_ =
             fVar113 * (float)bezier_basis0._484_4_ +
             fVar117 * (float)bezier_basis0._1640_4_ +
             (float)bezier_basis0._3952_4_ * fVar53 + (float)bezier_basis0._2796_4_ * fVar34;
        auVar191._12_4_ =
             auVar42._12_4_ * (float)bezier_basis0._488_4_ +
             auVar39._12_4_ * (float)bezier_basis0._1644_4_ +
             (float)bezier_basis0._3956_4_ * fVar55 + (float)bezier_basis0._2800_4_ * fVar54;
        auVar191._16_4_ =
             fVar95 * (float)bezier_basis0._492_4_ +
             fVar114 * (float)bezier_basis0._1648_4_ +
             (float)bezier_basis0._3960_4_ * fVar89 + (float)bezier_basis0._2804_4_ * fVar56;
        auVar191._20_4_ =
             fVar96 * (float)bezier_basis0._496_4_ +
             fVar116 * (float)bezier_basis0._1652_4_ +
             (float)bezier_basis0._3964_4_ * fVar93 + (float)bezier_basis0._2808_4_ * fVar91;
        auVar191._24_4_ =
             fVar113 * (float)bezier_basis0._500_4_ +
             fVar117 * (float)bezier_basis0._1656_4_ +
             (float)bezier_basis0._3968_4_ * fVar53 + (float)bezier_basis0._2812_4_ * fVar34;
        auVar191._28_4_ =
             (float)bezier_basis0._504_4_ +
             (float)bezier_basis0._3972_4_ + (float)bezier_basis0._2816_4_ + 0.0;
        auVar81._0_4_ =
             fVar95 * (float)bezier_basis0._5100_4_ +
             fVar114 * (float)bezier_basis0._6256_4_ +
             fVar56 * (float)bezier_basis0._7412_4_ + fVar89 * (float)bezier_basis0._8568_4_;
        auVar81._4_4_ =
             fVar96 * (float)bezier_basis0._5104_4_ +
             fVar116 * (float)bezier_basis0._6260_4_ +
             fVar91 * (float)bezier_basis0._7416_4_ + fVar93 * (float)bezier_basis0._8572_4_;
        auVar81._8_4_ =
             fVar113 * (float)bezier_basis0._5108_4_ +
             fVar117 * (float)bezier_basis0._6264_4_ +
             fVar34 * (float)bezier_basis0._7420_4_ + fVar53 * (float)bezier_basis0._8576_4_;
        auVar81._12_4_ =
             auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
             auVar39._12_4_ * (float)bezier_basis0._6268_4_ +
             fVar54 * (float)bezier_basis0._7424_4_ + fVar55 * (float)bezier_basis0._8580_4_;
        auVar81._16_4_ =
             fVar95 * (float)bezier_basis0._5116_4_ +
             fVar114 * (float)bezier_basis0._6272_4_ +
             fVar56 * (float)bezier_basis0._7428_4_ + fVar89 * (float)bezier_basis0._8584_4_;
        auVar81._20_4_ =
             fVar96 * (float)bezier_basis0._5120_4_ +
             fVar116 * (float)bezier_basis0._6276_4_ +
             fVar91 * (float)bezier_basis0._7432_4_ + fVar93 * (float)bezier_basis0._8588_4_;
        auVar81._24_4_ =
             fVar113 * (float)bezier_basis0._5124_4_ +
             fVar117 * (float)bezier_basis0._6280_4_ +
             fVar34 * (float)bezier_basis0._7436_4_ + fVar53 * (float)bezier_basis0._8592_4_;
        auVar81._28_4_ = fVar55 + fVar55 + fVar54 + fVar55;
        auVar50 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,1);
        auVar21._4_4_ = auVar50._4_4_ * 0.055555556;
        auVar21._0_4_ = auVar50._0_4_ * 0.055555556;
        auVar21._8_4_ = auVar50._8_4_ * 0.055555556;
        auVar21._12_4_ = auVar50._12_4_ * 0.055555556;
        auVar21._16_4_ = auVar50._16_4_ * 0.055555556;
        auVar21._20_4_ = auVar50._20_4_ * 0.055555556;
        auVar21._24_4_ = auVar50._24_4_ * 0.055555556;
        auVar21._28_4_ = auVar50._28_4_;
        auVar18 = vsubps_avx(auVar191,auVar21);
        auVar50 = vblendps_avx(auVar81,ZEXT832(0) << 0x20,0x80);
        auVar82._0_4_ = auVar191._0_4_ + auVar50._0_4_ * 0.055555556;
        auVar82._4_4_ = auVar191._4_4_ + auVar50._4_4_ * 0.055555556;
        auVar82._8_4_ = auVar191._8_4_ + auVar50._8_4_ * 0.055555556;
        auVar82._12_4_ = auVar191._12_4_ + auVar50._12_4_ * 0.055555556;
        auVar82._16_4_ = auVar191._16_4_ + auVar50._16_4_ * 0.055555556;
        auVar82._20_4_ = auVar191._20_4_ + auVar50._20_4_ * 0.055555556;
        auVar82._24_4_ = auVar191._24_4_ + auVar50._24_4_ * 0.055555556;
        auVar82._28_4_ = auVar191._28_4_ + auVar50._28_4_;
        auVar198._8_4_ = 0xff800000;
        auVar198._0_8_ = 0xff800000ff800000;
        auVar198._12_4_ = 0xff800000;
        auVar198._16_4_ = 0xff800000;
        auVar198._20_4_ = 0xff800000;
        auVar198._24_4_ = 0xff800000;
        auVar198._28_4_ = 0xff800000;
        auVar50 = vmaxps_avx(auVar198,auVar191);
        auVar15 = vmaxps_avx(auVar18,auVar82);
        auVar49 = vmaxps_avx(auVar50,auVar15);
        auVar39 = vshufps_avx(auVar41,auVar41,0);
        auVar42 = vshufps_avx(auVar193,auVar193,0);
        fVar95 = auVar39._0_4_;
        fVar96 = auVar39._4_4_;
        fVar113 = auVar39._8_4_;
        fVar114 = auVar39._12_4_;
        fVar116 = auVar42._0_4_;
        fVar117 = auVar42._4_4_;
        fVar119 = auVar42._8_4_;
        fVar120 = auVar42._12_4_;
        auVar39 = vpermilps_avx(auVar187,0);
        fVar34 = auVar39._0_4_;
        fVar53 = auVar39._4_4_;
        fVar54 = auVar39._8_4_;
        fVar55 = auVar39._12_4_;
        auVar39 = vpermilps_avx(auVar140,0);
        fVar56 = auVar39._0_4_;
        fVar89 = auVar39._4_4_;
        fVar91 = auVar39._8_4_;
        fVar93 = auVar39._12_4_;
        auVar184._0_4_ =
             fVar56 * (float)bezier_basis0._476_4_ +
             fVar34 * (float)bezier_basis0._1632_4_ +
             fVar95 * (float)bezier_basis0._2788_4_ + fVar116 * (float)bezier_basis0._3944_4_;
        auVar184._4_4_ =
             fVar89 * (float)bezier_basis0._480_4_ +
             fVar53 * (float)bezier_basis0._1636_4_ +
             fVar96 * (float)bezier_basis0._2792_4_ + fVar117 * (float)bezier_basis0._3948_4_;
        auVar184._8_4_ =
             fVar91 * (float)bezier_basis0._484_4_ +
             fVar54 * (float)bezier_basis0._1640_4_ +
             fVar113 * (float)bezier_basis0._2796_4_ + fVar119 * (float)bezier_basis0._3952_4_;
        auVar184._12_4_ =
             fVar93 * (float)bezier_basis0._488_4_ +
             fVar55 * (float)bezier_basis0._1644_4_ +
             fVar114 * (float)bezier_basis0._2800_4_ + fVar120 * (float)bezier_basis0._3956_4_;
        auVar184._16_4_ =
             fVar56 * (float)bezier_basis0._492_4_ +
             fVar34 * (float)bezier_basis0._1648_4_ +
             fVar95 * (float)bezier_basis0._2804_4_ + fVar116 * (float)bezier_basis0._3960_4_;
        auVar184._20_4_ =
             fVar89 * (float)bezier_basis0._496_4_ +
             fVar53 * (float)bezier_basis0._1652_4_ +
             fVar96 * (float)bezier_basis0._2808_4_ + fVar117 * (float)bezier_basis0._3964_4_;
        auVar184._24_4_ =
             fVar91 * (float)bezier_basis0._500_4_ +
             fVar54 * (float)bezier_basis0._1656_4_ +
             fVar113 * (float)bezier_basis0._2812_4_ + fVar119 * (float)bezier_basis0._3968_4_;
        auVar184._28_4_ = auVar15._28_4_ + 0.0 + 0.0 + 0.0;
        auVar143._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar56 +
             fVar95 * (float)bezier_basis0._7412_4_ + fVar116 * (float)bezier_basis0._8568_4_ +
             fVar34 * (float)bezier_basis0._6256_4_;
        auVar143._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar89 +
             fVar96 * (float)bezier_basis0._7416_4_ + fVar117 * (float)bezier_basis0._8572_4_ +
             fVar53 * (float)bezier_basis0._6260_4_;
        auVar143._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar91 +
             fVar113 * (float)bezier_basis0._7420_4_ + fVar119 * (float)bezier_basis0._8576_4_ +
             fVar54 * (float)bezier_basis0._6264_4_;
        auVar143._12_4_ =
             (float)bezier_basis0._5112_4_ * fVar93 +
             fVar114 * (float)bezier_basis0._7424_4_ + fVar120 * (float)bezier_basis0._8580_4_ +
             fVar55 * (float)bezier_basis0._6268_4_;
        auVar143._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar56 +
             fVar95 * (float)bezier_basis0._7428_4_ + fVar116 * (float)bezier_basis0._8584_4_ +
             fVar34 * (float)bezier_basis0._6272_4_;
        auVar143._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar89 +
             fVar96 * (float)bezier_basis0._7432_4_ + fVar117 * (float)bezier_basis0._8588_4_ +
             fVar53 * (float)bezier_basis0._6276_4_;
        auVar143._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar91 +
             fVar113 * (float)bezier_basis0._7436_4_ + fVar119 * (float)bezier_basis0._8592_4_ +
             fVar54 * (float)bezier_basis0._6280_4_;
        auVar143._28_4_ = fVar93 + fVar114 + fVar120 + fVar55;
        auVar50 = vblendps_avx(auVar143,ZEXT832(0) << 0x20,1);
        auVar22._4_4_ = auVar50._4_4_ * 0.055555556;
        auVar22._0_4_ = auVar50._0_4_ * 0.055555556;
        auVar22._8_4_ = auVar50._8_4_ * 0.055555556;
        auVar22._12_4_ = auVar50._12_4_ * 0.055555556;
        auVar22._16_4_ = auVar50._16_4_ * 0.055555556;
        auVar22._20_4_ = auVar50._20_4_ * 0.055555556;
        auVar22._24_4_ = auVar50._24_4_ * 0.055555556;
        auVar22._28_4_ = auVar50._28_4_;
        auVar110 = vsubps_avx(auVar184,auVar22);
        auVar50 = vblendps_avx(auVar143,ZEXT832(0) << 0x20,0x80);
        auVar144._0_4_ = auVar184._0_4_ + auVar50._0_4_ * 0.055555556;
        auVar144._4_4_ = auVar184._4_4_ + auVar50._4_4_ * 0.055555556;
        auVar144._8_4_ = auVar184._8_4_ + auVar50._8_4_ * 0.055555556;
        auVar144._12_4_ = auVar184._12_4_ + auVar50._12_4_ * 0.055555556;
        auVar144._16_4_ = auVar184._16_4_ + auVar50._16_4_ * 0.055555556;
        auVar144._20_4_ = auVar184._20_4_ + auVar50._20_4_ * 0.055555556;
        auVar144._24_4_ = auVar184._24_4_ + auVar50._24_4_ * 0.055555556;
        auVar144._28_4_ = auVar184._28_4_ + auVar50._28_4_;
        auVar50 = vmaxps_avx(auVar198,auVar184);
        auVar15 = vmaxps_avx(auVar110,auVar144);
        auVar15 = vmaxps_avx(auVar50,auVar15);
        auVar50 = vminps_avx(auVar17,auVar46);
        auVar195._8_4_ = 0x7f800000;
        auVar195._0_8_ = 0x7f8000007f800000;
        auVar195._12_4_ = 0x7f800000;
        auVar195._16_4_ = 0x7f800000;
        auVar195._20_4_ = 0x7f800000;
        auVar195._24_4_ = 0x7f800000;
        auVar195._28_4_ = 0x7f800000;
        auVar17 = vminps_avx(auVar195,auVar150);
        auVar16 = vminps_avx(auVar17,auVar50);
        auVar17 = vminps_avx(auVar18,auVar82);
        auVar18 = vminps_avx(auVar195,auVar191);
        auVar18 = vminps_avx(auVar18,auVar17);
        auVar17 = vminps_avx(auVar195,auVar184);
        auVar110 = vminps_avx(auVar110,auVar144);
        auVar110 = vminps_avx(auVar17,auVar110);
        auVar73 = vsubps_avx(auVar183,_local_2c8);
        auVar39 = vshufps_avx(auVar73,auVar73,0);
        auVar42 = vsubps_avx(auVar67,_local_138);
        auVar65._0_4_ = auVar73._0_4_ + auVar42._0_4_ * 0.33333334;
        auVar65._4_4_ = auVar73._4_4_ + auVar42._4_4_ * 0.33333334;
        auVar65._8_4_ = auVar73._8_4_ + auVar42._8_4_ * 0.33333334;
        auVar65._12_4_ = auVar73._12_4_ + auVar42._12_4_ * 0.33333334;
        auVar42 = vshufps_avx(auVar65,auVar65,0);
        auVar71 = vsubps_avx(auVar197,_local_358);
        auVar26._4_4_ = fVar90;
        auVar26._0_4_ = fVar57;
        auVar26._8_4_ = fVar92;
        auVar26._12_4_ = fVar94;
        auVar41 = vsubps_avx(auVar78,auVar26);
        auVar66._0_4_ = auVar41._0_4_ * 0.33333334;
        auVar66._4_4_ = auVar41._4_4_ * 0.33333334;
        auVar66._8_4_ = auVar41._8_4_ * 0.33333334;
        auVar66._12_4_ = auVar41._12_4_ * 0.33333334;
        auVar44 = vsubps_avx(auVar71,auVar66);
        auVar41 = vshufps_avx(auVar44,auVar44,0);
        fVar56 = auVar41._0_4_;
        fVar91 = auVar41._4_4_;
        fVar34 = auVar41._8_4_;
        fVar54 = auVar41._12_4_;
        auVar41 = vshufps_avx(auVar71,auVar71,0);
        fVar96 = auVar41._0_4_;
        fVar113 = auVar41._4_4_;
        fVar114 = auVar41._8_4_;
        fVar116 = auVar41._12_4_;
        fVar57 = auVar50._28_4_;
        fVar90 = auVar42._0_4_;
        fVar92 = auVar42._4_4_;
        fVar94 = auVar42._8_4_;
        fVar95 = auVar42._12_4_;
        fVar89 = auVar39._0_4_;
        fVar93 = auVar39._4_4_;
        fVar53 = auVar39._8_4_;
        fVar55 = auVar39._12_4_;
        auVar163._0_4_ =
             (float)bezier_basis0._476_4_ * fVar89 +
             fVar90 * (float)bezier_basis0._1632_4_ +
             (float)bezier_basis0._2788_4_ * fVar56 + fVar96 * (float)bezier_basis0._3944_4_;
        auVar163._4_4_ =
             (float)bezier_basis0._480_4_ * fVar93 +
             fVar92 * (float)bezier_basis0._1636_4_ +
             (float)bezier_basis0._2792_4_ * fVar91 + fVar113 * (float)bezier_basis0._3948_4_;
        auVar163._8_4_ =
             (float)bezier_basis0._484_4_ * fVar53 +
             fVar94 * (float)bezier_basis0._1640_4_ +
             (float)bezier_basis0._2796_4_ * fVar34 + fVar114 * (float)bezier_basis0._3952_4_;
        auVar163._12_4_ =
             (float)bezier_basis0._488_4_ * fVar55 +
             fVar95 * (float)bezier_basis0._1644_4_ +
             (float)bezier_basis0._2800_4_ * fVar54 + fVar116 * (float)bezier_basis0._3956_4_;
        auVar163._16_4_ =
             (float)bezier_basis0._492_4_ * fVar89 +
             fVar90 * (float)bezier_basis0._1648_4_ +
             (float)bezier_basis0._2804_4_ * fVar56 + fVar96 * (float)bezier_basis0._3960_4_;
        auVar163._20_4_ =
             (float)bezier_basis0._496_4_ * fVar93 +
             fVar92 * (float)bezier_basis0._1652_4_ +
             (float)bezier_basis0._2808_4_ * fVar91 + fVar113 * (float)bezier_basis0._3964_4_;
        auVar163._24_4_ =
             (float)bezier_basis0._500_4_ * fVar53 +
             fVar94 * (float)bezier_basis0._1656_4_ +
             (float)bezier_basis0._2812_4_ * fVar34 + fVar114 * (float)bezier_basis0._3968_4_;
        auVar163._28_4_ = fVar57 + fVar57 + fVar57 + 0.0;
        auVar83._8_4_ = 0xff800000;
        auVar83._0_8_ = 0xff800000ff800000;
        auVar83._12_4_ = 0xff800000;
        auVar83._16_4_ = 0xff800000;
        auVar83._20_4_ = 0xff800000;
        auVar83._24_4_ = 0xff800000;
        auVar83._28_4_ = 0xff800000;
        auVar17 = vmaxps_avx(auVar83,auVar163);
        auVar107._0_4_ =
             (float)bezier_basis0._5100_4_ * fVar89 +
             (float)bezier_basis0._6256_4_ * fVar90 +
             (float)bezier_basis0._7412_4_ * fVar56 + (float)bezier_basis0._8568_4_ * fVar96;
        auVar107._4_4_ =
             (float)bezier_basis0._5104_4_ * fVar93 +
             (float)bezier_basis0._6260_4_ * fVar92 +
             (float)bezier_basis0._7416_4_ * fVar91 + (float)bezier_basis0._8572_4_ * fVar113;
        auVar107._8_4_ =
             (float)bezier_basis0._5108_4_ * fVar53 +
             (float)bezier_basis0._6264_4_ * fVar94 +
             (float)bezier_basis0._7420_4_ * fVar34 + (float)bezier_basis0._8576_4_ * fVar114;
        auVar107._12_4_ =
             (float)bezier_basis0._5112_4_ * fVar55 +
             (float)bezier_basis0._6268_4_ * fVar95 +
             (float)bezier_basis0._7424_4_ * fVar54 + (float)bezier_basis0._8580_4_ * fVar116;
        auVar107._16_4_ =
             (float)bezier_basis0._5116_4_ * fVar89 +
             (float)bezier_basis0._6272_4_ * fVar90 +
             (float)bezier_basis0._7428_4_ * fVar56 + (float)bezier_basis0._8584_4_ * fVar96;
        auVar107._20_4_ =
             (float)bezier_basis0._5120_4_ * fVar93 +
             (float)bezier_basis0._6276_4_ * fVar92 +
             (float)bezier_basis0._7432_4_ * fVar91 + (float)bezier_basis0._8588_4_ * fVar113;
        auVar107._24_4_ =
             (float)bezier_basis0._5124_4_ * fVar53 +
             (float)bezier_basis0._6280_4_ * fVar94 +
             (float)bezier_basis0._7436_4_ * fVar34 + (float)bezier_basis0._8592_4_ * fVar114;
        auVar107._28_4_ = fVar55 + fVar95 + fVar54 + fVar116;
        auVar50 = vblendps_avx(auVar107,ZEXT832(0) << 0x20,1);
        auVar23._4_4_ = auVar50._4_4_ * 0.055555556;
        auVar23._0_4_ = auVar50._0_4_ * 0.055555556;
        auVar23._8_4_ = auVar50._8_4_ * 0.055555556;
        auVar23._12_4_ = auVar50._12_4_ * 0.055555556;
        auVar23._16_4_ = auVar50._16_4_ * 0.055555556;
        auVar23._20_4_ = auVar50._20_4_ * 0.055555556;
        auVar23._24_4_ = auVar50._24_4_ * 0.055555556;
        auVar23._28_4_ = auVar50._28_4_;
        auVar51 = vsubps_avx(auVar163,auVar23);
        auVar50 = vblendps_avx(auVar107,ZEXT832(0) << 0x20,0x80);
        auVar108._0_4_ = auVar163._0_4_ + auVar50._0_4_ * 0.055555556;
        auVar108._4_4_ = auVar163._4_4_ + auVar50._4_4_ * 0.055555556;
        auVar108._8_4_ = auVar163._8_4_ + auVar50._8_4_ * 0.055555556;
        auVar108._12_4_ = auVar163._12_4_ + auVar50._12_4_ * 0.055555556;
        auVar108._16_4_ = auVar163._16_4_ + auVar50._16_4_ * 0.055555556;
        auVar108._20_4_ = auVar163._20_4_ + auVar50._20_4_ * 0.055555556;
        auVar108._24_4_ = auVar163._24_4_ + auVar50._24_4_ * 0.055555556;
        auVar108._28_4_ = auVar163._28_4_ + auVar50._28_4_;
        auVar50 = vmaxps_avx(auVar51,auVar108);
        auVar50 = vmaxps_avx(auVar17,auVar50);
        auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
        auVar50 = vmaxps_avx(auVar50,auVar17);
        auVar17 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vmaxps_avx(auVar50,auVar17);
        auVar39 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar42 = vshufps_avx(auVar44,auVar44,0x55);
        auVar41 = vshufps_avx(auVar71,auVar71,0x55);
        fVar56 = auVar42._0_4_;
        fVar89 = auVar42._4_4_;
        fVar91 = auVar42._8_4_;
        fVar93 = auVar42._12_4_;
        fVar34 = auVar41._0_4_;
        fVar53 = auVar41._4_4_;
        fVar54 = auVar41._8_4_;
        auVar42 = vshufps_avx(auVar65,auVar65,0x55);
        fVar55 = auVar42._0_4_;
        fVar57 = auVar42._4_4_;
        fVar90 = auVar42._8_4_;
        auVar70 = vshufps_avx(auVar73,auVar73,0x55);
        fVar92 = auVar70._0_4_;
        fVar94 = auVar70._4_4_;
        fVar95 = auVar70._8_4_;
        auVar154._0_4_ =
             fVar92 * (float)bezier_basis0._476_4_ +
             fVar55 * (float)bezier_basis0._1632_4_ +
             fVar34 * (float)bezier_basis0._3944_4_ + (float)bezier_basis0._2788_4_ * fVar56;
        auVar154._4_4_ =
             fVar94 * (float)bezier_basis0._480_4_ +
             fVar57 * (float)bezier_basis0._1636_4_ +
             fVar53 * (float)bezier_basis0._3948_4_ + (float)bezier_basis0._2792_4_ * fVar89;
        auVar154._8_4_ =
             fVar95 * (float)bezier_basis0._484_4_ +
             fVar90 * (float)bezier_basis0._1640_4_ +
             fVar54 * (float)bezier_basis0._3952_4_ + (float)bezier_basis0._2796_4_ * fVar91;
        auVar154._12_4_ =
             auVar70._12_4_ * (float)bezier_basis0._488_4_ +
             auVar42._12_4_ * (float)bezier_basis0._1644_4_ +
             auVar41._12_4_ * (float)bezier_basis0._3956_4_ + (float)bezier_basis0._2800_4_ * fVar93
        ;
        auVar154._16_4_ =
             fVar92 * (float)bezier_basis0._492_4_ +
             fVar55 * (float)bezier_basis0._1648_4_ +
             fVar34 * (float)bezier_basis0._3960_4_ + (float)bezier_basis0._2804_4_ * fVar56;
        auVar154._20_4_ =
             fVar94 * (float)bezier_basis0._496_4_ +
             fVar57 * (float)bezier_basis0._1652_4_ +
             fVar53 * (float)bezier_basis0._3964_4_ + (float)bezier_basis0._2808_4_ * fVar89;
        auVar154._24_4_ =
             fVar95 * (float)bezier_basis0._500_4_ +
             fVar90 * (float)bezier_basis0._1656_4_ +
             fVar54 * (float)bezier_basis0._3968_4_ + (float)bezier_basis0._2812_4_ * fVar91;
        auVar154._28_4_ =
             (float)bezier_basis0._1660_4_ +
             (float)bezier_basis0._2816_4_ + (float)bezier_basis0._7440_4_ + 0.0;
        auVar126._0_4_ =
             fVar92 * (float)bezier_basis0._5100_4_ +
             fVar55 * (float)bezier_basis0._6256_4_ +
             fVar56 * (float)bezier_basis0._7412_4_ + fVar34 * (float)bezier_basis0._8568_4_;
        auVar126._4_4_ =
             fVar94 * (float)bezier_basis0._5104_4_ +
             fVar57 * (float)bezier_basis0._6260_4_ +
             fVar89 * (float)bezier_basis0._7416_4_ + fVar53 * (float)bezier_basis0._8572_4_;
        auVar126._8_4_ =
             fVar95 * (float)bezier_basis0._5108_4_ +
             fVar90 * (float)bezier_basis0._6264_4_ +
             fVar91 * (float)bezier_basis0._7420_4_ + fVar54 * (float)bezier_basis0._8576_4_;
        auVar126._12_4_ =
             auVar70._12_4_ * (float)bezier_basis0._5112_4_ +
             auVar42._12_4_ * (float)bezier_basis0._6268_4_ +
             fVar93 * (float)bezier_basis0._7424_4_ + auVar41._12_4_ * (float)bezier_basis0._8580_4_
        ;
        auVar126._16_4_ =
             fVar92 * (float)bezier_basis0._5116_4_ +
             fVar55 * (float)bezier_basis0._6272_4_ +
             fVar56 * (float)bezier_basis0._7428_4_ + fVar34 * (float)bezier_basis0._8584_4_;
        auVar126._20_4_ =
             fVar94 * (float)bezier_basis0._5120_4_ +
             fVar57 * (float)bezier_basis0._6276_4_ +
             fVar89 * (float)bezier_basis0._7432_4_ + fVar53 * (float)bezier_basis0._8588_4_;
        auVar126._24_4_ =
             fVar95 * (float)bezier_basis0._5124_4_ +
             fVar90 * (float)bezier_basis0._6280_4_ +
             fVar91 * (float)bezier_basis0._7436_4_ + fVar54 * (float)bezier_basis0._8592_4_;
        auVar126._28_4_ = fVar93 + fVar93 + (float)bezier_basis0._1660_4_ + fVar93;
        auVar50 = vblendps_avx(auVar126,ZEXT832(0) << 0x20,1);
        auVar24._4_4_ = auVar50._4_4_ * 0.055555556;
        auVar24._0_4_ = auVar50._0_4_ * 0.055555556;
        auVar24._8_4_ = auVar50._8_4_ * 0.055555556;
        auVar24._12_4_ = auVar50._12_4_ * 0.055555556;
        auVar24._16_4_ = auVar50._16_4_ * 0.055555556;
        auVar24._20_4_ = auVar50._20_4_ * 0.055555556;
        auVar24._24_4_ = auVar50._24_4_ * 0.055555556;
        auVar24._28_4_ = auVar50._28_4_;
        auVar19 = vsubps_avx(auVar154,auVar24);
        auVar50 = vblendps_avx(auVar126,ZEXT832(0) << 0x20,0x80);
        auVar205._0_4_ = auVar154._0_4_ + auVar50._0_4_ * 0.055555556;
        auVar205._4_4_ = auVar154._4_4_ + auVar50._4_4_ * 0.055555556;
        auVar205._8_4_ = auVar154._8_4_ + auVar50._8_4_ * 0.055555556;
        auVar205._12_4_ = auVar154._12_4_ + auVar50._12_4_ * 0.055555556;
        auVar205._16_4_ = auVar154._16_4_ + auVar50._16_4_ * 0.055555556;
        auVar205._20_4_ = auVar154._20_4_ + auVar50._20_4_ * 0.055555556;
        auVar205._24_4_ = auVar154._24_4_ + auVar50._24_4_ * 0.055555556;
        auVar205._28_4_ = auVar154._28_4_ + auVar50._28_4_;
        auVar127._8_4_ = 0xff800000;
        auVar127._0_8_ = 0xff800000ff800000;
        auVar127._12_4_ = 0xff800000;
        auVar127._16_4_ = 0xff800000;
        auVar127._20_4_ = 0xff800000;
        auVar127._24_4_ = 0xff800000;
        auVar127._28_4_ = 0xff800000;
        auVar50 = vmaxps_avx(auVar127,auVar154);
        auVar17 = vmaxps_avx(auVar19,auVar205);
        auVar50 = vmaxps_avx(auVar50,auVar17);
        auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
        auVar50 = vmaxps_avx(auVar50,auVar17);
        auVar17 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vmaxps_avx(auVar50,auVar17);
        auVar42 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar41 = vunpcklps_avx(auVar39,auVar42);
        auVar39 = vshufps_avx(auVar44,auVar44,0xaa);
        auVar42 = vshufps_avx(auVar71,auVar71,0xaa);
        fVar56 = auVar39._0_4_;
        fVar89 = auVar39._4_4_;
        fVar91 = auVar39._8_4_;
        fVar93 = auVar39._12_4_;
        fVar34 = auVar42._0_4_;
        fVar53 = auVar42._4_4_;
        fVar54 = auVar42._8_4_;
        fVar55 = auVar42._12_4_;
        auVar39 = vshufps_avx(auVar65,auVar65,0xaa);
        fVar57 = auVar39._0_4_;
        fVar90 = auVar39._4_4_;
        fVar92 = auVar39._8_4_;
        auVar42 = vshufps_avx(auVar73,auVar73,0xaa);
        fVar94 = auVar42._0_4_;
        fVar95 = auVar42._4_4_;
        fVar96 = auVar42._8_4_;
        auVar109._0_4_ =
             fVar94 * (float)bezier_basis0._476_4_ +
             fVar57 * (float)bezier_basis0._1632_4_ +
             fVar34 * (float)bezier_basis0._3944_4_ + fVar56 * (float)bezier_basis0._2788_4_;
        auVar109._4_4_ =
             fVar95 * (float)bezier_basis0._480_4_ +
             fVar90 * (float)bezier_basis0._1636_4_ +
             fVar53 * (float)bezier_basis0._3948_4_ + fVar89 * (float)bezier_basis0._2792_4_;
        auVar109._8_4_ =
             fVar96 * (float)bezier_basis0._484_4_ +
             fVar92 * (float)bezier_basis0._1640_4_ +
             fVar54 * (float)bezier_basis0._3952_4_ + fVar91 * (float)bezier_basis0._2796_4_;
        auVar109._12_4_ =
             auVar42._12_4_ * (float)bezier_basis0._488_4_ +
             auVar39._12_4_ * (float)bezier_basis0._1644_4_ +
             fVar55 * (float)bezier_basis0._3956_4_ + fVar93 * (float)bezier_basis0._2800_4_;
        auVar109._16_4_ =
             fVar94 * (float)bezier_basis0._492_4_ +
             fVar57 * (float)bezier_basis0._1648_4_ +
             fVar34 * (float)bezier_basis0._3960_4_ + fVar56 * (float)bezier_basis0._2804_4_;
        auVar109._20_4_ =
             fVar95 * (float)bezier_basis0._496_4_ +
             fVar90 * (float)bezier_basis0._1652_4_ +
             fVar53 * (float)bezier_basis0._3964_4_ + fVar89 * (float)bezier_basis0._2808_4_;
        auVar109._24_4_ =
             fVar96 * (float)bezier_basis0._500_4_ +
             fVar92 * (float)bezier_basis0._1656_4_ +
             fVar54 * (float)bezier_basis0._3968_4_ + fVar91 * (float)bezier_basis0._2812_4_;
        auVar109._28_4_ =
             (float)bezier_basis0._5128_4_ +
             (float)bezier_basis0._5128_4_ + (float)bezier_basis0._5128_4_ + 0.0;
        auVar128._0_4_ =
             fVar94 * (float)bezier_basis0._5100_4_ +
             fVar57 * (float)bezier_basis0._6256_4_ +
             fVar34 * (float)bezier_basis0._8568_4_ + fVar56 * (float)bezier_basis0._7412_4_;
        auVar128._4_4_ =
             fVar95 * (float)bezier_basis0._5104_4_ +
             fVar90 * (float)bezier_basis0._6260_4_ +
             fVar53 * (float)bezier_basis0._8572_4_ + fVar89 * (float)bezier_basis0._7416_4_;
        auVar128._8_4_ =
             fVar96 * (float)bezier_basis0._5108_4_ +
             fVar92 * (float)bezier_basis0._6264_4_ +
             fVar54 * (float)bezier_basis0._8576_4_ + fVar91 * (float)bezier_basis0._7420_4_;
        auVar128._12_4_ =
             auVar42._12_4_ * (float)bezier_basis0._5112_4_ +
             auVar39._12_4_ * (float)bezier_basis0._6268_4_ +
             fVar55 * (float)bezier_basis0._8580_4_ + fVar93 * (float)bezier_basis0._7424_4_;
        auVar128._16_4_ =
             fVar94 * (float)bezier_basis0._5116_4_ +
             fVar57 * (float)bezier_basis0._6272_4_ +
             fVar34 * (float)bezier_basis0._8584_4_ + fVar56 * (float)bezier_basis0._7428_4_;
        auVar128._20_4_ =
             fVar95 * (float)bezier_basis0._5120_4_ +
             fVar90 * (float)bezier_basis0._6276_4_ +
             fVar53 * (float)bezier_basis0._8588_4_ + fVar89 * (float)bezier_basis0._7432_4_;
        auVar128._24_4_ =
             fVar96 * (float)bezier_basis0._5124_4_ +
             fVar92 * (float)bezier_basis0._6280_4_ +
             fVar54 * (float)bezier_basis0._8592_4_ + fVar91 * (float)bezier_basis0._7436_4_;
        auVar128._28_4_ = fVar55 + fVar55 + fVar55 + fVar93;
        auVar50 = vblendps_avx(auVar128,ZEXT832(0) << 0x20,1);
        auVar25._4_4_ = auVar50._4_4_ * 0.055555556;
        auVar25._0_4_ = auVar50._0_4_ * 0.055555556;
        auVar25._8_4_ = auVar50._8_4_ * 0.055555556;
        auVar25._12_4_ = auVar50._12_4_ * 0.055555556;
        auVar25._16_4_ = auVar50._16_4_ * 0.055555556;
        auVar25._20_4_ = auVar50._20_4_ * 0.055555556;
        auVar25._24_4_ = auVar50._24_4_ * 0.055555556;
        auVar25._28_4_ = auVar50._28_4_;
        auVar20 = vsubps_avx(auVar109,auVar25);
        auVar50 = vblendps_avx(auVar128,ZEXT832(0) << 0x20,0x80);
        auVar185._0_4_ = auVar109._0_4_ + auVar50._0_4_ * 0.055555556;
        auVar185._4_4_ = auVar109._4_4_ + auVar50._4_4_ * 0.055555556;
        auVar185._8_4_ = auVar109._8_4_ + auVar50._8_4_ * 0.055555556;
        auVar185._12_4_ = auVar109._12_4_ + auVar50._12_4_ * 0.055555556;
        auVar185._16_4_ = auVar109._16_4_ + auVar50._16_4_ * 0.055555556;
        auVar185._20_4_ = auVar109._20_4_ + auVar50._20_4_ * 0.055555556;
        auVar185._24_4_ = auVar109._24_4_ + auVar50._24_4_ * 0.055555556;
        auVar185._28_4_ = auVar109._28_4_ + auVar50._28_4_;
        auVar47._8_4_ = 0xff800000;
        auVar47._0_8_ = 0xff800000ff800000;
        auVar47._12_4_ = 0xff800000;
        auVar47._16_4_ = 0xff800000;
        auVar47._20_4_ = 0xff800000;
        auVar47._24_4_ = 0xff800000;
        auVar47._28_4_ = 0xff800000;
        auVar50 = vmaxps_avx(auVar47,auVar109);
        auVar17 = vmaxps_avx(auVar20,auVar185);
        auVar50 = vmaxps_avx(auVar50,auVar17);
        auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
        auVar50 = vmaxps_avx(auVar50,auVar17);
        auVar17 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vmaxps_avx(auVar50,auVar17);
        auVar39 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar39 = vinsertps_avx(auVar41,auVar39,0x28);
        auVar50 = vminps_avx(auVar51,auVar108);
        auVar48._8_4_ = 0x7f800000;
        auVar48._0_8_ = 0x7f8000007f800000;
        auVar48._12_4_ = 0x7f800000;
        auVar48._16_4_ = 0x7f800000;
        auVar48._20_4_ = 0x7f800000;
        auVar48._24_4_ = 0x7f800000;
        auVar48._28_4_ = 0x7f800000;
        auVar17 = vminps_avx(auVar48,auVar163);
        auVar50 = vminps_avx(auVar17,auVar50);
        auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
        auVar50 = vminps_avx(auVar50,auVar17);
        auVar17 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vminps_avx(auVar50,auVar17);
        auVar42 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar50 = vminps_avx(auVar19,auVar205);
        auVar17 = vminps_avx(auVar48,auVar154);
        auVar152._8_4_ = 0x5dccb9a2;
        auVar152._0_8_ = 0x5dccb9a25dccb9a2;
        auVar152._12_4_ = 0x5dccb9a2;
        auVar156 = ZEXT1664(auVar152);
        auVar50 = vminps_avx(auVar17,auVar50);
        auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
        auVar50 = vminps_avx(auVar50,auVar17);
        auVar17 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vminps_avx(auVar50,auVar17);
        auVar41 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar41 = vunpcklps_avx(auVar42,auVar41);
        auVar50 = vminps_avx(auVar20,auVar185);
        auVar17 = vminps_avx(auVar48,auVar109);
        auVar50 = vminps_avx(auVar17,auVar50);
        auVar17 = vshufps_avx(auVar50,auVar50,0xb1);
        auVar50 = vminps_avx(auVar50,auVar17);
        auVar17 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vminps_avx(auVar50,auVar17);
        auVar42 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar42 = vinsertps_avx(auVar41,auVar42,0x28);
        auVar50 = vshufps_avx(auVar110,auVar110,0xb1);
        auVar50 = vminps_avx(auVar110,auVar50);
        auVar17 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vminps_avx(auVar50,auVar17);
        auVar41 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar50 = vshufps_avx(auVar18,auVar18,0xb1);
        auVar50 = vminps_avx(auVar18,auVar50);
        auVar17 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vminps_avx(auVar50,auVar17);
        auVar70 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar70 = vunpcklps_avx(auVar41,auVar70);
        auVar50 = vshufps_avx(auVar16,auVar16,0xb1);
        auVar50 = vminps_avx(auVar16,auVar50);
        auVar17 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vminps_avx(auVar50,auVar17);
        auVar41 = vminps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar41 = vinsertps_avx(auVar70,auVar41,0x28);
        auVar70 = vminps_avx(auVar42,auVar41);
        auVar50 = vshufps_avx(auVar15,auVar15,0xb1);
        auVar50 = vmaxps_avx(auVar15,auVar50);
        auVar15 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vmaxps_avx(auVar50,auVar15);
        auVar42 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar50 = vshufps_avx(auVar49,auVar49,0xb1);
        auVar50 = vmaxps_avx(auVar49,auVar50);
        auVar15 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vmaxps_avx(auVar50,auVar15);
        auVar41 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar41 = vunpcklps_avx(auVar42,auVar41);
        auVar50 = vshufps_avx(auVar14,auVar14,0xb1);
        auVar50 = vmaxps_avx(auVar14,auVar50);
        auVar14 = vshufpd_avx(auVar50,auVar50,5);
        auVar50 = vmaxps_avx(auVar50,auVar14);
        auVar42 = vmaxps_avx(auVar50._0_16_,auVar50._16_16_);
        auVar42 = vinsertps_avx(auVar41,auVar42,0x28);
        auVar42 = vmaxps_avx(auVar39,auVar42);
        auVar160._8_4_ = 0xddccb9a2;
        auVar160._0_8_ = 0xddccb9a2ddccb9a2;
        auVar160._12_4_ = 0xddccb9a2;
        auVar166 = ZEXT1664(auVar160);
        auVar39 = vcmpps_avx(auVar70,auVar160,6);
        auVar42 = vcmpps_avx(auVar42,auVar152,1);
        auVar39 = vandps_avx(auVar42,auVar39);
        uVar27 = vmovmskps_avx(auVar39);
        lVar29 = lVar29 + 0x38;
      } while ((~(byte)uVar27 & 7) == 0);
    }
    uVar30 = uVar30 + 1;
  } while( true );
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }